

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  int iVar44;
  undefined4 uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar52;
  undefined8 uVar48;
  RayK<4> *pRVar49;
  RTCFilterFunctionN p_Var50;
  undefined1 (*pauVar51) [16];
  int iVar53;
  ulong uVar54;
  bool bVar55;
  ulong uVar56;
  int iVar57;
  bool bVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  short sVar63;
  float fVar64;
  float fVar65;
  float fVar108;
  float fVar110;
  __m128 a_1;
  undefined2 uVar107;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  float fVar109;
  float fVar111;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar112;
  float fVar135;
  float fVar136;
  vfloat_impl<4> t;
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar148;
  float fVar149;
  vfloat4 a;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  float fVar168;
  float fVar169;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar178;
  float fVar179;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar191;
  float fVar192;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar193;
  float fVar205;
  float fVar206;
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  undefined1 auVar208 [8];
  float fVar231;
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  float fVar230;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  float fVar239;
  float fVar240;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar260;
  float fVar261;
  undefined1 auVar256 [16];
  float fVar262;
  undefined1 auVar259 [16];
  float fVar263;
  float fVar266;
  float fVar268;
  float fVar271;
  undefined1 auVar264 [16];
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  undefined1 auVar265 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar280;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar285;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar287 [16];
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_568 [16];
  ulong local_550;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [4];
  float fStack_514;
  undefined8 uStack_510;
  RTCRayQueryContext *local_508;
  RayK<4> *local_500;
  RTCHitN *local_4f8;
  uint local_4f0;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 (*local_450) [16];
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  Primitive *local_3a8;
  ulong local_3a0;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 uVar106;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar176 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar229 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar277 [16];
  undefined1 auVar286 [16];
  
  PVar6 = prim[1];
  uVar46 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar46 * 0x19 + 6;
  fVar149 = *(float *)(pPVar5 + 0xc);
  fVar170 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar149;
  fVar178 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar149;
  fVar179 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar149;
  fVar137 = *(float *)(ray + k * 4 + 0x40) * fVar149;
  fVar148 = *(float *)(ray + k * 4 + 0x50) * fVar149;
  fVar149 = *(float *)(ray + k * 4 + 0x60) * fVar149;
  uVar52 = *(undefined4 *)(prim + uVar46 * 4 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar47;
  auVar73._12_2_ = uVar107;
  auVar73._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar183._12_4_ = auVar73._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar47;
  auVar183._10_2_ = uVar107;
  auVar184._10_6_ = auVar183._10_6_;
  auVar184._8_2_ = uVar107;
  auVar184._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar29._4_8_ = auVar184._8_8_;
  auVar29._2_2_ = uVar107;
  auVar29._0_2_ = uVar107;
  fVar112 = (float)((int)sVar63 >> 8);
  fVar135 = (float)(auVar29._0_4_ >> 0x18);
  fVar136 = (float)(auVar184._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar46 * 5 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar47;
  auVar199._12_2_ = uVar107;
  auVar199._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar202._12_4_ = auVar199._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar47;
  auVar202._10_2_ = uVar107;
  auVar66._10_6_ = auVar202._10_6_;
  auVar66._8_2_ = uVar107;
  auVar66._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar30._4_8_ = auVar66._8_8_;
  auVar30._2_2_ = uVar107;
  auVar30._0_2_ = uVar107;
  fVar180 = (float)((int)sVar63 >> 8);
  fVar191 = (float)(auVar30._0_4_ >> 0x18);
  fVar192 = (float)(auVar66._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar46 * 6 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar47;
  auVar69._12_2_ = uVar107;
  auVar69._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar47;
  auVar68._10_2_ = uVar107;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar107;
  auVar67._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar31._4_8_ = auVar67._8_8_;
  auVar31._2_2_ = uVar107;
  auVar31._0_2_ = uVar107;
  fVar150 = (float)((int)sVar63 >> 8);
  fVar168 = (float)(auVar31._0_4_ >> 0x18);
  fVar169 = (float)(auVar67._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar46 * 0xb + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar47;
  auVar72._12_2_ = uVar107;
  auVar72._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar47;
  auVar71._10_2_ = uVar107;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar107;
  auVar70._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar32._4_8_ = auVar70._8_8_;
  auVar32._2_2_ = uVar107;
  auVar32._0_2_ = uVar107;
  fVar64 = (float)((int)sVar63 >> 8);
  fVar108 = (float)(auVar32._0_4_ >> 0x18);
  fVar110 = (float)(auVar70._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar47;
  auVar196._12_2_ = uVar107;
  auVar196._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar47;
  auVar195._10_2_ = uVar107;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar107;
  auVar194._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar33._4_8_ = auVar194._8_8_;
  auVar33._2_2_ = uVar107;
  auVar33._0_2_ = uVar107;
  fVar193 = (float)((int)sVar63 >> 8);
  fVar205 = (float)(auVar33._0_4_ >> 0x18);
  fVar206 = (float)(auVar194._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar46 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar47;
  auVar211._12_2_ = uVar107;
  auVar211._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar47;
  auVar210._10_2_ = uVar107;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar107;
  auVar209._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar34._4_8_ = auVar209._8_8_;
  auVar34._2_2_ = uVar107;
  auVar34._0_2_ = uVar107;
  fVar241 = (float)((int)sVar63 >> 8);
  fVar245 = (float)(auVar34._0_4_ >> 0x18);
  fVar246 = (float)(auVar209._8_4_ >> 0x18);
  uVar56 = (ulong)(uint)((int)(uVar46 * 9) * 2);
  uVar52 = *(undefined4 *)(prim + uVar56 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar47;
  auVar214._12_2_ = uVar107;
  auVar214._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar47;
  auVar213._10_2_ = uVar107;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar107;
  auVar212._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar35._4_8_ = auVar212._8_8_;
  auVar35._2_2_ = uVar107;
  auVar35._0_2_ = uVar107;
  fVar232 = (float)((int)sVar63 >> 8);
  fVar239 = (float)(auVar35._0_4_ >> 0x18);
  fVar240 = (float)(auVar212._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar56 + uVar46 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar47;
  auVar217._12_2_ = uVar107;
  auVar217._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar47;
  auVar216._10_2_ = uVar107;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar107;
  auVar215._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar36._4_8_ = auVar215._8_8_;
  auVar36._2_2_ = uVar107;
  auVar36._0_2_ = uVar107;
  fVar247 = (float)((int)sVar63 >> 8);
  fVar253 = (float)(auVar36._0_4_ >> 0x18);
  fVar254 = (float)(auVar215._8_4_ >> 0x18);
  uVar54 = (ulong)(uint)((int)(uVar46 * 5) << 2);
  uVar52 = *(undefined4 *)(prim + uVar54 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar48 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar48 >> 0x20),uVar106),uVar106);
  sVar63 = CONCAT11((char)uVar52,(char)uVar52);
  uVar47 = CONCAT62(uVar28,sVar63);
  auVar258._8_4_ = 0;
  auVar258._0_8_ = uVar47;
  auVar258._12_2_ = uVar107;
  auVar258._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar48 >> 0x20);
  auVar257._12_4_ = auVar258._12_4_;
  auVar257._8_2_ = 0;
  auVar257._0_8_ = uVar47;
  auVar257._10_2_ = uVar107;
  auVar256._10_6_ = auVar257._10_6_;
  auVar256._8_2_ = uVar107;
  auVar256._0_8_ = uVar47;
  uVar107 = (undefined2)uVar28;
  auVar37._4_8_ = auVar256._8_8_;
  auVar37._2_2_ = uVar107;
  auVar37._0_2_ = uVar107;
  fVar65 = (float)((int)sVar63 >> 8);
  fVar109 = (float)(auVar37._0_4_ >> 0x18);
  fVar111 = (float)(auVar256._8_4_ >> 0x18);
  fVar263 = fVar137 * fVar112 + fVar148 * fVar180 + fVar149 * fVar150;
  fVar266 = fVar137 * fVar135 + fVar148 * fVar191 + fVar149 * fVar168;
  fVar268 = fVar137 * fVar136 + fVar148 * fVar192 + fVar149 * fVar169;
  fVar271 = fVar137 * (float)(auVar183._12_4_ >> 0x18) +
            fVar148 * (float)(auVar202._12_4_ >> 0x18) + fVar149 * (float)(auVar68._12_4_ >> 0x18);
  fVar255 = fVar137 * fVar64 + fVar148 * fVar193 + fVar149 * fVar241;
  fVar260 = fVar137 * fVar108 + fVar148 * fVar205 + fVar149 * fVar245;
  fVar261 = fVar137 * fVar110 + fVar148 * fVar206 + fVar149 * fVar246;
  fVar262 = fVar137 * (float)(auVar71._12_4_ >> 0x18) +
            fVar148 * (float)(auVar195._12_4_ >> 0x18) + fVar149 * (float)(auVar210._12_4_ >> 0x18);
  fVar207 = fVar137 * fVar232 + fVar148 * fVar247 + fVar149 * fVar65;
  fVar230 = fVar137 * fVar239 + fVar148 * fVar253 + fVar149 * fVar109;
  fVar231 = fVar137 * fVar240 + fVar148 * fVar254 + fVar149 * fVar111;
  fVar137 = fVar137 * (float)(auVar213._12_4_ >> 0x18) +
            fVar148 * (float)(auVar216._12_4_ >> 0x18) + fVar149 * (float)(auVar257._12_4_ >> 0x18);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar150 = fVar112 * fVar170 + fVar180 * fVar178 + fVar150 * fVar179;
  fVar168 = fVar135 * fVar170 + fVar191 * fVar178 + fVar168 * fVar179;
  fVar169 = fVar136 * fVar170 + fVar192 * fVar178 + fVar169 * fVar179;
  fVar180 = (float)(auVar183._12_4_ >> 0x18) * fVar170 +
            (float)(auVar202._12_4_ >> 0x18) * fVar178 + (float)(auVar68._12_4_ >> 0x18) * fVar179;
  fVar241 = fVar64 * fVar170 + fVar193 * fVar178 + fVar241 * fVar179;
  fVar205 = fVar108 * fVar170 + fVar205 * fVar178 + fVar245 * fVar179;
  fVar206 = fVar110 * fVar170 + fVar206 * fVar178 + fVar246 * fVar179;
  fVar245 = (float)(auVar71._12_4_ >> 0x18) * fVar170 +
            (float)(auVar195._12_4_ >> 0x18) * fVar178 + (float)(auVar210._12_4_ >> 0x18) * fVar179;
  fVar191 = fVar170 * fVar232 + fVar178 * fVar247 + fVar179 * fVar65;
  fVar192 = fVar170 * fVar239 + fVar178 * fVar253 + fVar179 * fVar109;
  fVar193 = fVar170 * fVar240 + fVar178 * fVar254 + fVar179 * fVar111;
  fVar170 = fVar170 * (float)(auVar213._12_4_ >> 0x18) +
            fVar178 * (float)(auVar216._12_4_ >> 0x18) + fVar179 * (float)(auVar257._12_4_ >> 0x18);
  fVar149 = (float)DAT_01f80d30;
  fVar64 = DAT_01f80d30._4_4_;
  fVar65 = DAT_01f80d30._8_4_;
  fVar108 = DAT_01f80d30._12_4_;
  uVar59 = -(uint)(fVar149 <= ABS(fVar263));
  uVar60 = -(uint)(fVar64 <= ABS(fVar266));
  uVar61 = -(uint)(fVar65 <= ABS(fVar268));
  uVar62 = -(uint)(fVar108 <= ABS(fVar271));
  auVar264._0_4_ = (uint)fVar263 & uVar59;
  auVar264._4_4_ = (uint)fVar266 & uVar60;
  auVar264._8_4_ = (uint)fVar268 & uVar61;
  auVar264._12_4_ = (uint)fVar271 & uVar62;
  auVar171._0_4_ = ~uVar59 & (uint)fVar149;
  auVar171._4_4_ = ~uVar60 & (uint)fVar64;
  auVar171._8_4_ = ~uVar61 & (uint)fVar65;
  auVar171._12_4_ = ~uVar62 & (uint)fVar108;
  auVar171 = auVar171 | auVar264;
  uVar59 = -(uint)(fVar149 <= ABS(fVar255));
  uVar60 = -(uint)(fVar64 <= ABS(fVar260));
  uVar61 = -(uint)(fVar65 <= ABS(fVar261));
  uVar62 = -(uint)(fVar108 <= ABS(fVar262));
  auVar259._0_4_ = (uint)fVar255 & uVar59;
  auVar259._4_4_ = (uint)fVar260 & uVar60;
  auVar259._8_4_ = (uint)fVar261 & uVar61;
  auVar259._12_4_ = (uint)fVar262 & uVar62;
  auVar181._0_4_ = ~uVar59 & (uint)fVar149;
  auVar181._4_4_ = ~uVar60 & (uint)fVar64;
  auVar181._8_4_ = ~uVar61 & (uint)fVar65;
  auVar181._12_4_ = ~uVar62 & (uint)fVar108;
  auVar181 = auVar181 | auVar259;
  uVar59 = -(uint)(fVar149 <= ABS(fVar207));
  uVar60 = -(uint)(fVar64 <= ABS(fVar230));
  uVar61 = -(uint)(fVar65 <= ABS(fVar231));
  uVar62 = -(uint)(fVar108 <= ABS(fVar137));
  auVar218._0_4_ = (uint)fVar207 & uVar59;
  auVar218._4_4_ = (uint)fVar230 & uVar60;
  auVar218._8_4_ = (uint)fVar231 & uVar61;
  auVar218._12_4_ = (uint)fVar137 & uVar62;
  auVar197._0_4_ = ~uVar59 & (uint)fVar149;
  auVar197._4_4_ = ~uVar60 & (uint)fVar64;
  auVar197._8_4_ = ~uVar61 & (uint)fVar65;
  auVar197._12_4_ = ~uVar62 & (uint)fVar108;
  auVar197 = auVar197 | auVar218;
  auVar73 = rcpps(_DAT_01f80d30,auVar171);
  fVar149 = auVar73._0_4_;
  fVar108 = auVar73._4_4_;
  fVar111 = auVar73._8_4_;
  fVar136 = auVar73._12_4_;
  fVar149 = (1.0 - auVar171._0_4_ * fVar149) * fVar149 + fVar149;
  fVar108 = (1.0 - auVar171._4_4_ * fVar108) * fVar108 + fVar108;
  fVar111 = (1.0 - auVar171._8_4_ * fVar111) * fVar111 + fVar111;
  fVar136 = (1.0 - auVar171._12_4_ * fVar136) * fVar136 + fVar136;
  auVar73 = rcpps(auVar73,auVar181);
  fVar64 = auVar73._0_4_;
  fVar109 = auVar73._4_4_;
  fVar112 = auVar73._8_4_;
  fVar137 = auVar73._12_4_;
  fVar64 = (1.0 - auVar181._0_4_ * fVar64) * fVar64 + fVar64;
  fVar109 = (1.0 - auVar181._4_4_ * fVar109) * fVar109 + fVar109;
  fVar112 = (1.0 - auVar181._8_4_ * fVar112) * fVar112 + fVar112;
  fVar137 = (1.0 - auVar181._12_4_ * fVar137) * fVar137 + fVar137;
  auVar73 = rcpps(auVar73,auVar197);
  fVar65 = auVar73._0_4_;
  fVar110 = auVar73._4_4_;
  fVar135 = auVar73._8_4_;
  fVar148 = auVar73._12_4_;
  fVar65 = (1.0 - auVar197._0_4_ * fVar65) * fVar65 + fVar65;
  fVar110 = (1.0 - auVar197._4_4_ * fVar110) * fVar110 + fVar110;
  fVar135 = (1.0 - auVar197._8_4_ * fVar135) * fVar135 + fVar135;
  fVar148 = (1.0 - auVar197._12_4_ * fVar148) * fVar148 + fVar148;
  uVar47 = *(ulong *)(prim + uVar46 * 7 + 6);
  uVar107 = (undefined2)(uVar47 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar47;
  auVar76._12_2_ = uVar107;
  auVar76._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar47 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar47;
  auVar75._10_2_ = uVar107;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar107;
  auVar74._0_8_ = uVar47;
  uVar107 = (undefined2)(uVar47 >> 0x10);
  auVar38._4_8_ = auVar74._8_8_;
  auVar38._2_2_ = uVar107;
  auVar38._0_2_ = uVar107;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar168) * fVar108,
                ((float)(int)(short)uVar47 - fVar150) * fVar149);
  auVar172._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar169) * fVar111;
  auVar172._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar180) * fVar136;
  uVar47 = *(ulong *)(prim + uVar46 * 9 + 6);
  uVar107 = (undefined2)(uVar47 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar47;
  auVar79._12_2_ = uVar107;
  auVar79._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar47 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar47;
  auVar78._10_2_ = uVar107;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar107;
  auVar77._0_8_ = uVar47;
  uVar107 = (undefined2)(uVar47 >> 0x10);
  auVar39._4_8_ = auVar77._8_8_;
  auVar39._2_2_ = uVar107;
  auVar39._0_2_ = uVar107;
  auVar198._0_4_ = ((float)(int)(short)uVar47 - fVar150) * fVar149;
  auVar198._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar168) * fVar108;
  auVar198._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar169) * fVar111;
  auVar198._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar180) * fVar136;
  uVar47 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar56 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar46 * -2 + 6);
  uVar107 = (undefined2)(uVar56 >> 0x30);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar56;
  auVar115._12_2_ = uVar107;
  auVar115._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar56 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar56;
  auVar114._10_2_ = uVar107;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar107;
  auVar113._0_8_ = uVar56;
  uVar107 = (undefined2)(uVar56 >> 0x10);
  auVar40._4_8_ = auVar113._8_8_;
  auVar40._2_2_ = uVar107;
  auVar40._0_2_ = uVar107;
  auVar116._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar205) * fVar109,
                ((float)(int)(short)uVar56 - fVar241) * fVar64);
  auVar116._8_4_ = ((float)(auVar113._8_4_ >> 0x10) - fVar206) * fVar112;
  auVar116._12_4_ = ((float)(auVar114._12_4_ >> 0x10) - fVar245) * fVar137;
  uVar107 = (undefined2)(uVar47 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar47;
  auVar82._12_2_ = uVar107;
  auVar82._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar47 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar47;
  auVar81._10_2_ = uVar107;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar107;
  auVar80._0_8_ = uVar47;
  uVar107 = (undefined2)(uVar47 >> 0x10);
  auVar41._4_8_ = auVar80._8_8_;
  auVar41._2_2_ = uVar107;
  auVar41._0_2_ = uVar107;
  auVar233._0_4_ = ((float)(int)(short)uVar47 - fVar241) * fVar64;
  auVar233._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar205) * fVar109;
  auVar233._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar206) * fVar112;
  auVar233._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar245) * fVar137;
  uVar47 = *(ulong *)(prim + uVar54 + uVar46 + 6);
  uVar107 = (undefined2)(uVar47 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar47;
  auVar85._12_2_ = uVar107;
  auVar85._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar47 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar47;
  auVar84._10_2_ = uVar107;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar107;
  auVar83._0_8_ = uVar47;
  uVar107 = (undefined2)(uVar47 >> 0x10);
  auVar42._4_8_ = auVar83._8_8_;
  auVar42._2_2_ = uVar107;
  auVar42._0_2_ = uVar107;
  auVar86._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar192) * fVar110,
                ((float)(int)(short)uVar47 - fVar191) * fVar65);
  auVar86._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar193) * fVar135;
  auVar86._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar170) * fVar148;
  uVar47 = *(ulong *)(prim + uVar46 * 0x17 + 6);
  uVar107 = (undefined2)(uVar47 >> 0x30);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar47;
  auVar221._12_2_ = uVar107;
  auVar221._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar47 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar47;
  auVar220._10_2_ = uVar107;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar107;
  auVar219._0_8_ = uVar47;
  uVar107 = (undefined2)(uVar47 >> 0x10);
  auVar43._4_8_ = auVar219._8_8_;
  auVar43._2_2_ = uVar107;
  auVar43._0_2_ = uVar107;
  auVar222._0_4_ = ((float)(int)(short)uVar47 - fVar191) * fVar65;
  auVar222._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar192) * fVar110;
  auVar222._8_4_ = ((float)(auVar219._8_4_ >> 0x10) - fVar193) * fVar135;
  auVar222._12_4_ = ((float)(auVar220._12_4_ >> 0x10) - fVar170) * fVar148;
  auVar182._8_4_ = auVar172._8_4_;
  auVar182._0_8_ = auVar172._0_8_;
  auVar182._12_4_ = auVar172._12_4_;
  auVar183 = minps(auVar182,auVar198);
  auVar138._8_4_ = auVar116._8_4_;
  auVar138._0_8_ = auVar116._0_8_;
  auVar138._12_4_ = auVar116._12_4_;
  auVar73 = minps(auVar138,auVar233);
  auVar183 = maxps(auVar183,auVar73);
  auVar139._8_4_ = auVar86._8_4_;
  auVar139._0_8_ = auVar86._0_8_;
  auVar139._12_4_ = auVar86._12_4_;
  auVar73 = minps(auVar139,auVar222);
  auVar151._4_4_ = uVar52;
  auVar151._0_4_ = uVar52;
  auVar151._8_4_ = uVar52;
  auVar151._12_4_ = uVar52;
  auVar73 = maxps(auVar73,auVar151);
  auVar184 = maxps(auVar183,auVar73);
  auVar183 = maxps(auVar172,auVar198);
  auVar73 = maxps(auVar116,auVar233);
  auVar183 = minps(auVar183,auVar73);
  local_1f8 = auVar184._0_4_ * 0.99999964;
  fStack_1f4 = auVar184._4_4_ * 0.99999964;
  fStack_1f0 = auVar184._8_4_ * 0.99999964;
  fStack_1ec = auVar184._12_4_ * 0.99999964;
  auVar73 = maxps(auVar86,auVar222);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar117._4_4_ = uVar52;
  auVar117._0_4_ = uVar52;
  auVar117._8_4_ = uVar52;
  auVar117._12_4_ = uVar52;
  auVar73 = minps(auVar73,auVar117);
  auVar73 = minps(auVar183,auVar73);
  auVar118._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_1f8 <= auVar73._0_4_ * 1.0000004);
  auVar118._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_1f4 <= auVar73._4_4_ * 1.0000004);
  auVar118._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_1f0 <= auVar73._8_4_ * 1.0000004);
  auVar118._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_1ec <= auVar73._12_4_ * 1.0000004);
  uVar59 = movmskps((uint)(byte)PVar6,auVar118);
  if (uVar59 == 0) {
    return false;
  }
  local_3a8 = prim;
  uVar59 = uVar59 & 0xff;
  local_1b8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1b8._12_4_ = 0;
  local_450 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00a7fed1:
  local_3a0 = (ulong)uVar59;
  lVar8 = 0;
  if (local_3a0 != 0) {
    for (; (uVar59 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  local_3a0 = local_3a0 - 1 & local_3a0;
  local_388 = *(uint *)(local_3a8 + 2);
  local_550 = (ulong)local_388;
  local_398 = *(uint *)(local_3a8 + lVar8 * 4 + 6);
  uVar47 = (ulong)local_398;
  pGVar7 = (context->scene->geometries).items[local_550].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * uVar47);
  p_Var50 = pGVar7[1].intersectionFilterN;
  lVar8 = 0;
  if (local_3a0 != 0) {
    for (; (local_3a0 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar8 + (long)p_Var50 * uVar56);
  pfVar2 = (float *)(lVar8 + (uVar56 + 1) * (long)p_Var50);
  pfVar3 = (float *)(lVar8 + (uVar56 + 2) * (long)p_Var50);
  pfVar4 = (float *)(lVar8 + (uVar56 + 3) * (long)p_Var50);
  if (((local_3a0 != 0) && (uVar56 = local_3a0 - 1 & local_3a0, uVar56 != 0)) &&
     (lVar8 = 0, uVar56 != 0)) {
    for (; (uVar56 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  fStack_13c = *(float *)(ray + k * 4 + 0x40);
  fVar149 = *(float *)(ray + k * 4 + 0x50);
  fVar65 = *(float *)(ray + k * 4 + 0x60);
  local_528._4_4_ = fVar149;
  local_528._0_4_ = fStack_13c;
  fStack_520 = fVar65;
  fStack_51c = 0.0;
  fVar64 = fVar149 * fVar149;
  fVar109 = fVar65 * fVar65;
  fVar108 = fVar64 + fStack_13c * fStack_13c + fVar109;
  auVar87._0_8_ = CONCAT44(fVar64 + fVar64 + 0.0,fVar108);
  auVar87._8_4_ = fVar64 + fVar109 + fVar109;
  auVar87._12_4_ = fVar64 + 0.0 + 0.0;
  auVar185._8_4_ = auVar87._8_4_;
  auVar185._0_8_ = auVar87._0_8_;
  auVar185._12_4_ = auVar87._12_4_;
  auVar73 = rcpss(auVar185,auVar87);
  fVar112 = (2.0 - auVar73._0_4_ * fVar108) * auVar73._0_4_ *
            (((pfVar1[2] + pfVar2[2]) * 0.5 - *(float *)(ray + k * 4 + 0x20)) * fVar65 +
            ((pfVar1[1] + pfVar2[1]) * 0.5 - *(float *)(ray + k * 4 + 0x10)) * fVar149 +
            ((*pfVar1 + *pfVar2) * 0.5 - *(float *)(ray + k * 4)) * fStack_13c);
  fVar110 = fStack_13c * fVar112 + *(float *)(ray + k * 4);
  fVar111 = fVar149 * fVar112 + *(float *)(ray + k * 4 + 0x10);
  local_338 = fVar65 * fVar112 + *(float *)(ray + k * 4 + 0x20);
  local_2b8 = *pfVar1 - fVar110;
  local_158 = pfVar1[1] - fVar111;
  local_2c8 = pfVar1[2] - local_338;
  fStack_40c = pfVar1[3] - 0.0;
  fVar135 = *pfVar3 - fVar110;
  fVar136 = pfVar3[1] - fVar111;
  local_318 = pfVar3[2] - local_338;
  fStack_42c = pfVar3[3] - 0.0;
  local_2d8 = *pfVar2 - fVar110;
  local_2e8 = pfVar2[1] - fVar111;
  local_2f8 = pfVar2[2] - local_338;
  fStack_41c = pfVar2[3] - 0.0;
  fVar110 = *pfVar4 - fVar110;
  fVar111 = pfVar4[1] - fVar111;
  local_338 = pfVar4[2] - local_338;
  fStack_43c = pfVar4[3] - 0.0;
  fStack_2b4 = local_2b8;
  fStack_2b0 = local_2b8;
  fStack_2ac = local_2b8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_2c4 = local_2c8;
  fStack_2c0 = local_2c8;
  fStack_2bc = local_2c8;
  local_418 = local_2b8;
  fStack_414 = local_158;
  fStack_410 = local_2c8;
  local_168 = fStack_40c;
  fStack_164 = fStack_40c;
  fStack_160 = fStack_40c;
  fStack_15c = fStack_40c;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fVar64 = fVar149 * fVar149;
  local_428 = local_2d8;
  fStack_424 = local_2e8;
  fStack_420 = local_2f8;
  local_308 = fStack_41c;
  fStack_304 = fStack_41c;
  fStack_300 = fStack_41c;
  fStack_2fc = fStack_41c;
  fStack_13c = fStack_13c * fStack_13c;
  local_148 = fStack_13c + fVar64 + fVar109;
  fStack_144 = fStack_13c + fVar64 + fVar109;
  fStack_140 = fStack_13c + fVar64 + fVar109;
  fStack_13c = fStack_13c + fVar64 + fVar109;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  local_438 = fVar135;
  fStack_434 = fVar136;
  fStack_430 = local_318;
  local_328 = fStack_42c;
  fStack_324 = fStack_42c;
  fStack_320 = fStack_42c;
  fStack_31c = fStack_42c;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_448 = fVar110;
  fStack_444 = fVar111;
  fStack_440 = local_338;
  local_348 = fStack_43c;
  fStack_344 = fStack_43c;
  fStack_340 = fStack_43c;
  fStack_33c = fStack_43c;
  local_4d8 = *(float *)(ray + k * 4 + 0x40);
  fStack_4d4 = local_4d8;
  fStack_4d0 = local_4d8;
  fStack_4cc = local_4d8;
  local_358 = ABS(local_148);
  fStack_354 = ABS(fStack_144);
  fStack_350 = ABS(fStack_140);
  fStack_34c = ABS(fStack_13c);
  fVar64 = *(float *)(ray + k * 4 + 0x30);
  local_3d8 = ZEXT416((uint)fVar112);
  local_1a8 = fVar64 - fVar112;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  uStack_384 = local_388;
  uStack_380 = local_388;
  uStack_37c = local_388;
  uStack_394 = local_398;
  uStack_390 = local_398;
  uStack_38c = local_398;
  iVar53 = 1;
  uVar56 = 0;
  bVar55 = false;
  local_198 = 0.0;
  fStack_194 = 1.0;
  do {
    iVar57 = (int)uVar56;
    local_5a8._4_4_ = fStack_194 - local_198;
    uStack_190 = 0;
    uStack_18c = 0;
    local_5a8._0_4_ = local_5a8._4_4_;
    fStack_5a0 = (float)local_5a8._4_4_;
    fStack_59c = (float)local_5a8._4_4_;
    fVar150 = (float)local_5a8._4_4_ * 0.0 + local_198;
    fVar169 = (float)local_5a8._4_4_ * 0.33333334 + local_198;
    fVar193 = (float)local_5a8._4_4_ * 0.6666667 + local_198;
    fVar178 = (float)local_5a8._4_4_ * 1.0 + local_198;
    fVar231 = 1.0 - fVar150;
    fVar247 = 1.0 - fVar169;
    fVar255 = 1.0 - fVar193;
    fVar262 = 1.0 - fVar178;
    fVar205 = fVar150 * 3.0;
    fVar206 = fVar169 * 3.0;
    fVar207 = fVar193 * 3.0;
    fVar230 = fVar178 * 3.0;
    fVar191 = ((fVar231 * 3.0 + -5.0) * fVar231 * fVar231 + 2.0) * 0.5;
    fVar192 = ((fVar247 * 3.0 + -5.0) * fVar247 * fVar247 + 2.0) * 0.5;
    fVar170 = ((fVar255 * 3.0 + -5.0) * fVar255 * fVar255 + 2.0) * 0.5;
    fVar179 = ((fVar262 * 3.0 + -5.0) * fVar262 * fVar262 + 2.0) * 0.5;
    fVar137 = -fVar231 * fVar150 * fVar150 * 0.5;
    fVar148 = -fVar247 * fVar169 * fVar169 * 0.5;
    fVar168 = -fVar255 * fVar193 * fVar193 * 0.5;
    fVar180 = -fVar262 * fVar178 * fVar178 * 0.5;
    fVar232 = (fVar150 * fVar150 * (fVar205 + -5.0) + 2.0) * 0.5;
    fVar239 = (fVar169 * fVar169 * (fVar206 + -5.0) + 2.0) * 0.5;
    fVar253 = (fVar193 * fVar193 * (fVar207 + -5.0) + 2.0) * 0.5;
    fVar254 = (fVar178 * fVar178 * (fVar230 + -5.0) + 2.0) * 0.5;
    fVar109 = (float)local_5a8._4_4_ * 0.11111111;
    fVar260 = -fVar150 * fVar231 * fVar231 * 0.5;
    fVar261 = -fVar169 * fVar247 * fVar247 * 0.5;
    fVar263 = -fVar193 * fVar255 * fVar255 * 0.5;
    fVar266 = -fVar178 * fVar262 * fVar262 * 0.5;
    fVar240 = local_2b8 * fVar260 + local_2d8 * fVar232 + fVar135 * fVar191 + fVar110 * fVar137;
    fVar241 = fStack_2b4 * fVar261 + fStack_2d4 * fVar239 + fVar135 * fVar192 + fVar110 * fVar148;
    fVar245 = fStack_2b0 * fVar263 + fStack_2d0 * fVar253 + fVar135 * fVar170 + fVar110 * fVar168;
    fVar246 = fStack_2ac * fVar266 + fStack_2cc * fVar254 + fVar135 * fVar179 + fVar110 * fVar180;
    fVar285 = local_158 * fVar260 + local_2e8 * fVar232 + fVar136 * fVar191 + fVar111 * fVar137;
    fVar288 = fStack_154 * fVar261 + fStack_2e4 * fVar239 + fVar136 * fVar192 + fVar111 * fVar148;
    fVar289 = fStack_150 * fVar263 + fStack_2e0 * fVar253 + fVar136 * fVar170 + fVar111 * fVar168;
    fVar290 = fStack_14c * fVar266 + fStack_2dc * fVar254 + fVar136 * fVar179 + fVar111 * fVar180;
    fVar268 = local_2c8 * fVar260 + local_2f8 * fVar232 + local_318 * fVar191 + local_338 * fVar137;
    fVar271 = fStack_2c4 * fVar261 +
              fStack_2f4 * fVar239 + fStack_314 * fVar192 + fStack_334 * fVar148;
    fVar269 = fStack_2c0 * fVar263 +
              fStack_2f0 * fVar253 + fStack_310 * fVar170 + fStack_330 * fVar168;
    fVar272 = fStack_2bc * fVar266 +
              fStack_2ec * fVar254 + fStack_30c * fVar179 + fStack_32c * fVar180;
    fVar137 = fVar260 * local_168 + fVar232 * local_308 + fVar191 * local_328 + fVar137 * local_348;
    fVar148 = fVar261 * fStack_164 +
              fVar239 * fStack_304 + fVar192 * fStack_324 + fVar148 * fStack_344;
    fVar168 = fVar263 * fStack_160 +
              fVar253 * fStack_300 + fVar170 * fStack_320 + fVar168 * fStack_340;
    fVar180 = fVar266 * fStack_15c +
              fVar254 * fStack_2fc + fVar179 * fStack_31c + fVar180 * fStack_33c;
    fVar232 = fVar150 * (fVar231 + fVar231);
    fVar253 = fVar169 * (fVar247 + fVar247);
    fVar260 = fVar193 * (fVar255 + fVar255);
    fVar263 = fVar178 * (fVar262 + fVar262);
    fVar239 = (fVar232 - fVar231 * fVar231) * 0.5;
    fVar254 = (fVar253 - fVar247 * fVar247) * 0.5;
    fVar261 = (fVar260 - fVar255 * fVar255) * 0.5;
    fVar266 = (fVar263 - fVar262 * fVar262) * 0.5;
    fVar192 = (fVar150 * fVar205 + (fVar150 + fVar150) * (fVar205 + -5.0)) * 0.5;
    fVar191 = (fVar169 * fVar206 + (fVar169 + fVar169) * (fVar206 + -5.0)) * 0.5;
    fVar170 = (fVar193 * fVar207 + (fVar193 + fVar193) * (fVar207 + -5.0)) * 0.5;
    fVar179 = (fVar178 * fVar230 + (fVar178 + fVar178) * (fVar230 + -5.0)) * 0.5;
    fVar205 = ((fVar205 + 2.0) * (fVar231 + fVar231) - fVar231 * 3.0 * fVar231) * 0.5;
    fVar206 = ((fVar206 + 2.0) * (fVar247 + fVar247) - fVar247 * 3.0 * fVar247) * 0.5;
    fVar207 = ((fVar207 + 2.0) * (fVar255 + fVar255) - fVar255 * 3.0 * fVar255) * 0.5;
    fVar230 = ((fVar230 + 2.0) * (fVar262 + fVar262) - fVar262 * 3.0 * fVar262) * 0.5;
    fVar231 = (fVar150 * fVar150 - fVar232) * 0.5;
    fVar150 = (fVar169 * fVar169 - fVar253) * 0.5;
    fVar169 = (fVar193 * fVar193 - fVar260) * 0.5;
    fVar193 = (fVar178 * fVar178 - fVar263) * 0.5;
    fVar280 = (local_2b8 * fVar239 + local_2d8 * fVar192 + fVar135 * fVar205 + fVar110 * fVar231) *
              fVar109;
    local_4b8 = (fStack_2b4 * fVar254 + fStack_2d4 * fVar191 + fVar135 * fVar206 + fVar110 * fVar150
                ) * fVar109;
    fStack_4b4 = (fStack_2b0 * fVar261 +
                 fStack_2d0 * fVar170 + fVar135 * fVar207 + fVar110 * fVar169) * fVar109;
    fStack_4b0 = (fStack_2ac * fVar266 +
                 fStack_2cc * fVar179 + fVar135 * fVar230 + fVar110 * fVar193) * fVar109;
    local_468 = (local_158 * fVar239 + local_2e8 * fVar192 + fVar136 * fVar205 + fVar111 * fVar231)
                * fVar109;
    fStack_464 = (fStack_154 * fVar254 +
                 fStack_2e4 * fVar191 + fVar136 * fVar206 + fVar111 * fVar150) * fVar109;
    fStack_460 = (fStack_150 * fVar261 +
                 fStack_2e0 * fVar170 + fVar136 * fVar207 + fVar111 * fVar169) * fVar109;
    fStack_45c = (fStack_14c * fVar266 +
                 fStack_2dc * fVar179 + fVar136 * fVar230 + fVar111 * fVar193) * fVar109;
    local_478._0_4_ =
         (local_2c8 * fVar239 + local_2f8 * fVar192 + local_318 * fVar205 + local_338 * fVar231) *
         fVar109;
    local_478._4_4_ =
         (fStack_2c4 * fVar254 + fStack_2f4 * fVar191 + fStack_314 * fVar206 + fStack_334 * fVar150)
         * fVar109;
    fStack_470 = (fStack_2c0 * fVar261 +
                 fStack_2f0 * fVar170 + fStack_310 * fVar207 + fStack_330 * fVar169) * fVar109;
    fStack_46c = (fStack_2bc * fVar266 +
                 fStack_2ec * fVar179 + fStack_30c * fVar230 + fStack_32c * fVar193) * fVar109;
    fVar150 = fVar109 * (fVar254 * fStack_164 +
                        fVar191 * fStack_304 + fVar206 * fStack_324 + fVar150 * fStack_344);
    fVar169 = fVar109 * (fVar261 * fStack_160 +
                        fVar170 * fStack_300 + fVar207 * fStack_320 + fVar169 * fStack_340);
    fVar191 = fVar109 * (fVar266 * fStack_15c +
                        fVar179 * fStack_2fc + fVar230 * fStack_31c + fVar193 * fStack_33c);
    auVar12._4_4_ = fVar148;
    auVar12._0_4_ = fVar137;
    auVar12._8_4_ = fVar168;
    auVar12._12_4_ = fVar180;
    auVar173._0_12_ = auVar12._4_12_;
    auVar173._12_4_ = 0;
    auVar223._0_4_ =
         fVar137 + fVar109 * (fVar239 * local_168 +
                             fVar192 * local_308 + fVar205 * local_328 + fVar231 * local_348);
    auVar223._4_4_ = fVar148 + fVar150;
    auVar223._8_4_ = fVar168 + fVar169;
    auVar223._12_4_ = fVar180 + fVar191;
    auVar234._0_8_ = CONCAT44(fVar168 - fVar169,fVar148 - fVar150);
    auVar234._8_4_ = fVar180 - fVar191;
    auVar234._12_4_ = 0;
    local_3e8._0_4_ = fVar288 - fVar285;
    local_3e8._4_4_ = fVar289 - fVar288;
    fStack_3e0 = fVar290 - fVar289;
    fStack_3dc = 0.0 - fVar290;
    fVar179 = fVar271 - fVar268;
    fVar205 = fVar269 - fVar271;
    fVar206 = fVar272 - fVar269;
    fVar207 = 0.0 - fVar272;
    fVar109 = local_468 * fVar179 - (float)local_478._0_4_ * (float)local_3e8._0_4_;
    fVar150 = fStack_464 * fVar205 - (float)local_478._4_4_ * (float)local_3e8._4_4_;
    fVar169 = fStack_460 * fVar206 - fStack_470 * fStack_3e0;
    fVar191 = fStack_45c * fVar207 - fStack_46c * fStack_3dc;
    local_3f8._0_4_ = fVar241 - fVar240;
    local_3f8._4_4_ = fVar245 - fVar241;
    fStack_3f0 = fVar246 - fVar245;
    fStack_3ec = 0.0 - fVar246;
    fVar230 = (float)local_478._0_4_ * (float)local_3f8._0_4_ - fVar280 * fVar179;
    fVar231 = (float)local_478._4_4_ * (float)local_3f8._4_4_ - local_4b8 * fVar205;
    fVar232 = fStack_470 * fStack_3f0 - fStack_4b4 * fVar206;
    fVar239 = fStack_46c * fStack_3ec - fStack_4b0 * fVar207;
    fVar247 = fVar280 * (float)local_3e8._0_4_ - local_468 * (float)local_3f8._0_4_;
    fVar253 = local_4b8 * (float)local_3e8._4_4_ - fStack_464 * (float)local_3f8._4_4_;
    fVar254 = fStack_4b4 * fStack_3e0 - fStack_460 * fStack_3f0;
    fVar255 = fStack_4b0 * fStack_3dc - fStack_45c * fStack_3ec;
    auVar119._0_4_ = fVar179 * fVar179;
    auVar119._4_4_ = fVar205 * fVar205;
    auVar119._8_4_ = fVar206 * fVar206;
    auVar119._12_4_ = fVar207 * fVar207;
    auVar152._0_4_ =
         (float)local_3f8._0_4_ * (float)local_3f8._0_4_ +
         (float)local_3e8._0_4_ * (float)local_3e8._0_4_ + auVar119._0_4_;
    auVar152._4_4_ =
         (float)local_3f8._4_4_ * (float)local_3f8._4_4_ +
         (float)local_3e8._4_4_ * (float)local_3e8._4_4_ + auVar119._4_4_;
    auVar152._8_4_ = fStack_3f0 * fStack_3f0 + fStack_3e0 * fStack_3e0 + auVar119._8_4_;
    auVar152._12_4_ = fStack_3ec * fStack_3ec + fStack_3dc * fStack_3dc + auVar119._12_4_;
    auVar73 = rcpps(auVar119,auVar152);
    fVar192 = auVar73._0_4_;
    fVar193 = auVar73._4_4_;
    fVar170 = auVar73._8_4_;
    fVar178 = auVar73._12_4_;
    fVar192 = (1.0 - fVar192 * auVar152._0_4_) * fVar192 + fVar192;
    fVar193 = (1.0 - fVar193 * auVar152._4_4_) * fVar193 + fVar193;
    fVar170 = (1.0 - fVar170 * auVar152._8_4_) * fVar170 + fVar170;
    fVar178 = (1.0 - fVar178 * auVar152._12_4_) * fVar178 + fVar178;
    fVar260 = fVar179 * fStack_464 - (float)local_3e8._0_4_ * (float)local_478._4_4_;
    fVar261 = fVar205 * fStack_460 - (float)local_3e8._4_4_ * fStack_470;
    fVar262 = fVar206 * fStack_45c - fStack_3e0 * fStack_46c;
    fVar263 = fVar207 * 0.0 - fStack_3dc * 0.0;
    local_498 = (float)local_478._4_4_;
    fStack_494 = fStack_470;
    fStack_490 = fStack_46c;
    fStack_48c = 0.0;
    auVar13._4_4_ = fVar148;
    auVar13._0_4_ = fVar137;
    auVar13._8_4_ = fVar168;
    auVar13._12_4_ = fVar180;
    fVar137 = (float)local_3f8._0_4_ * (float)local_478._4_4_ - fVar179 * local_4b8;
    fVar148 = (float)local_3f8._4_4_ * fStack_470 - fVar205 * fStack_4b4;
    fVar168 = fStack_3f0 * fStack_46c - fVar206 * fStack_4b0;
    fVar180 = fStack_3ec * 0.0 - fVar207 * 0.0;
    local_488 = fStack_464;
    fStack_484 = fStack_460;
    fStack_480 = fStack_45c;
    fStack_47c = 0.0;
    fStack_4ac = 0.0;
    fVar266 = (float)local_3e8._0_4_ * local_4b8 - (float)local_3f8._0_4_ * fStack_464;
    fVar267 = (float)local_3e8._4_4_ * fStack_4b4 - (float)local_3f8._4_4_ * fStack_460;
    fVar270 = fStack_3e0 * fStack_4b0 - fStack_3f0 * fStack_45c;
    fVar273 = fStack_3dc * 0.0 - fStack_3ec * 0.0;
    auVar88._0_4_ = (fVar109 * fVar109 + fVar230 * fVar230 + fVar247 * fVar247) * fVar192;
    auVar88._4_4_ = (fVar150 * fVar150 + fVar231 * fVar231 + fVar253 * fVar253) * fVar193;
    auVar88._8_4_ = (fVar169 * fVar169 + fVar232 * fVar232 + fVar254 * fVar254) * fVar170;
    auVar88._12_4_ = (fVar191 * fVar191 + fVar239 * fVar239 + fVar255 * fVar255) * fVar178;
    auVar242._0_4_ = (fVar260 * fVar260 + fVar137 * fVar137 + fVar266 * fVar266) * fVar192;
    auVar242._4_4_ = (fVar261 * fVar261 + fVar148 * fVar148 + fVar267 * fVar267) * fVar193;
    auVar242._8_4_ = (fVar262 * fVar262 + fVar168 * fVar168 + fVar270 * fVar270) * fVar170;
    auVar242._12_4_ = (fVar263 * fVar263 + fVar180 * fVar180 + fVar273 * fVar273) * fVar178;
    auVar73 = maxps(auVar88,auVar242);
    auVar183 = maxps(auVar13,auVar223);
    auVar243._8_4_ = auVar234._8_4_;
    auVar243._0_8_ = auVar234._0_8_;
    auVar243._12_4_ = 0;
    auVar184 = maxps(auVar243,auVar173);
    auVar199 = maxps(auVar183,auVar184);
    auVar183 = minps(auVar13,auVar223);
    auVar184 = minps(auVar234,auVar173);
    auVar184 = minps(auVar183,auVar184);
    auVar73 = sqrtps(auVar73,auVar73);
    auVar183 = rsqrtps(auVar73,auVar152);
    fVar109 = auVar183._0_4_;
    fVar137 = auVar183._4_4_;
    fVar148 = auVar183._8_4_;
    fVar150 = auVar183._12_4_;
    fVar230 = fVar109 * 1.5 - fVar109 * fVar109 * auVar152._0_4_ * 0.5 * fVar109;
    fVar231 = fVar137 * 1.5 - fVar137 * fVar137 * auVar152._4_4_ * 0.5 * fVar137;
    fVar232 = fVar148 * 1.5 - fVar148 * fVar148 * auVar152._8_4_ * 0.5 * fVar148;
    fVar239 = fVar150 * 1.5 - fVar150 * fVar150 * auVar152._12_4_ * 0.5 * fVar150;
    fVar109 = 0.0 - fVar285;
    fVar148 = 0.0 - fVar288;
    fVar168 = 0.0 - fVar289;
    fVar180 = 0.0 - fVar290;
    local_4c8 = 0.0 - fVar268;
    fStack_4c4 = 0.0 - fVar271;
    fStack_4c0 = 0.0 - fVar269;
    fStack_4bc = 0.0 - fVar272;
    local_4a8._0_4_ = 0.0 - fVar240;
    local_4a8._4_4_ = 0.0 - fVar241;
    fStack_4a0 = 0.0 - fVar245;
    fStack_49c = 0.0 - fVar246;
    auVar274._8_4_ = fVar232;
    auVar274._0_8_ = CONCAT44(fVar231,fVar230);
    auVar274._12_4_ = fVar239;
    local_1e8 = local_4d8 * (float)local_3f8._0_4_ * fVar230 +
                fVar149 * (float)local_3e8._0_4_ * fVar230 + fVar65 * fVar179 * fVar230;
    fStack_1e4 = fStack_4d4 * (float)local_3f8._4_4_ * fVar231 +
                 fVar149 * (float)local_3e8._4_4_ * fVar231 + fVar65 * fVar205 * fVar231;
    fStack_1e0 = fStack_4d0 * fStack_3f0 * fVar232 +
                 fVar149 * fStack_3e0 * fVar232 + fVar65 * fVar206 * fVar232;
    fStack_1dc = fStack_4cc * fStack_3ec * fVar239 +
                 fVar149 * fStack_3dc * fVar239 + fVar65 * fVar207 * fVar239;
    local_178 = (float)local_3f8._0_4_ * fVar230 * (float)local_4a8._0_4_ +
                (float)local_3e8._0_4_ * fVar230 * fVar109 + fVar179 * fVar230 * local_4c8;
    fStack_174 = (float)local_3f8._4_4_ * fVar231 * (float)local_4a8._4_4_ +
                 (float)local_3e8._4_4_ * fVar231 * fVar148 + fVar205 * fVar231 * fStack_4c4;
    fStack_170 = fStack_3f0 * fVar232 * fStack_4a0 +
                 fStack_3e0 * fVar232 * fVar168 + fVar206 * fVar232 * fStack_4c0;
    fStack_16c = fStack_3ec * fVar239 * fStack_49c +
                 fStack_3dc * fVar239 * fVar180 + fVar207 * fVar239 * fStack_4bc;
    local_188 = (local_4d8 * (float)local_4a8._0_4_ + fVar149 * fVar109 + fVar65 * local_4c8) -
                local_1e8 * local_178;
    fStack_184 = (fStack_4d4 * (float)local_4a8._4_4_ + fVar149 * fVar148 + fVar65 * fStack_4c4) -
                 fStack_1e4 * fStack_174;
    fStack_180 = (fStack_4d0 * fStack_4a0 + fVar149 * fVar168 + fVar65 * fStack_4c0) -
                 fStack_1e0 * fStack_170;
    fStack_17c = (fStack_4cc * fStack_49c + fVar149 * fVar180 + fVar65 * fStack_4bc) -
                 fStack_1dc * fStack_16c;
    fVar137 = ((float)local_4a8._0_4_ * (float)local_4a8._0_4_ +
              fVar109 * fVar109 + local_4c8 * local_4c8) - local_178 * local_178;
    fVar150 = ((float)local_4a8._4_4_ * (float)local_4a8._4_4_ +
              fVar148 * fVar148 + fStack_4c4 * fStack_4c4) - fStack_174 * fStack_174;
    fVar169 = (fStack_4a0 * fStack_4a0 + fVar168 * fVar168 + fStack_4c0 * fStack_4c0) -
              fStack_170 * fStack_170;
    fVar191 = (fStack_49c * fStack_49c + fVar180 * fVar180 + fStack_4bc * fStack_4bc) -
              fStack_16c * fStack_16c;
    fVar192 = (auVar199._0_4_ + auVar73._0_4_) * 1.0000002;
    fVar193 = (auVar199._4_4_ + auVar73._4_4_) * 1.0000002;
    fVar170 = (auVar199._8_4_ + auVar73._8_4_) * 1.0000002;
    fVar178 = (auVar199._12_4_ + auVar73._12_4_) * 1.0000002;
    auVar235._0_4_ = fVar137 - fVar192 * fVar192;
    auVar235._4_4_ = fVar150 - fVar193 * fVar193;
    auVar235._8_4_ = fVar169 - fVar170 * fVar170;
    auVar235._12_4_ = fVar191 - fVar178 * fVar178;
    local_408 = local_1e8 * local_1e8;
    fStack_404 = fStack_1e4 * fStack_1e4;
    fStack_400 = fStack_1e0 * fStack_1e0;
    fStack_3fc = fStack_1dc * fStack_1dc;
    local_368 = local_148 - local_408;
    fStack_364 = fStack_144 - fStack_404;
    fStack_360 = fStack_140 - fStack_400;
    fStack_35c = fStack_13c - fStack_3fc;
    local_188 = local_188 + local_188;
    fStack_184 = fStack_184 + fStack_184;
    fStack_180 = fStack_180 + fStack_180;
    fStack_17c = fStack_17c + fStack_17c;
    local_4e8._0_4_ = local_368 * 4.0;
    local_4e8._4_4_ = fStack_364 * 4.0;
    fStack_4e0 = fStack_360 * 4.0;
    fStack_4dc = fStack_35c * 4.0;
    auVar265._0_4_ = local_188 * local_188 - (float)local_4e8._0_4_ * auVar235._0_4_;
    auVar265._4_4_ = fStack_184 * fStack_184 - (float)local_4e8._4_4_ * auVar235._4_4_;
    auVar265._8_4_ = fStack_180 * fStack_180 - fStack_4e0 * auVar235._8_4_;
    auVar265._12_4_ = fStack_17c * fStack_17c - fStack_4dc * auVar235._12_4_;
    auVar153._4_4_ = -(uint)(0.0 <= auVar265._4_4_);
    auVar153._0_4_ = -(uint)(0.0 <= auVar265._0_4_);
    auVar153._8_4_ = -(uint)(0.0 <= auVar265._8_4_);
    auVar153._12_4_ = -(uint)(0.0 <= auVar265._12_4_);
    uVar52 = (undefined4)(uVar47 >> 0x20);
    iVar44 = movmskps((int)uVar47,auVar153);
    if (iVar44 == 0) {
      iVar44 = 0;
      auVar236 = _DAT_01f7a9f0;
      auVar249 = _DAT_01f7aa00;
    }
    else {
      auVar199 = sqrtps(auVar274,auVar265);
      bVar58 = 0.0 <= auVar265._0_4_;
      uVar59 = -(uint)bVar58;
      bVar9 = 0.0 <= auVar265._4_4_;
      uVar60 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar265._8_4_;
      uVar61 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar265._12_4_;
      uVar62 = -(uint)bVar11;
      auVar200._0_4_ = local_368 + local_368;
      auVar200._4_4_ = fStack_364 + fStack_364;
      auVar200._8_4_ = fStack_360 + fStack_360;
      auVar200._12_4_ = fStack_35c + fStack_35c;
      auVar183 = rcpps(auVar235,auVar200);
      fVar192 = auVar183._0_4_;
      fVar193 = auVar183._4_4_;
      fVar170 = auVar183._8_4_;
      fVar178 = auVar183._12_4_;
      fVar192 = (1.0 - auVar200._0_4_ * fVar192) * fVar192 + fVar192;
      fVar193 = (1.0 - auVar200._4_4_ * fVar193) * fVar193 + fVar193;
      fVar170 = (1.0 - auVar200._8_4_ * fVar170) * fVar170 + fVar170;
      fVar178 = (1.0 - auVar200._12_4_ * fVar178) * fVar178 + fVar178;
      fVar247 = (-local_188 - auVar199._0_4_) * fVar192;
      fVar253 = (-fStack_184 - auVar199._4_4_) * fVar193;
      fVar254 = (-fStack_180 - auVar199._8_4_) * fVar170;
      fVar255 = (-fStack_17c - auVar199._12_4_) * fVar178;
      fVar192 = (auVar199._0_4_ - local_188) * fVar192;
      fVar193 = (auVar199._4_4_ - fStack_184) * fVar193;
      fVar170 = (auVar199._8_4_ - fStack_180) * fVar170;
      fVar178 = (auVar199._12_4_ - fStack_17c) * fVar178;
      local_1d8 = (local_1e8 * fVar247 + local_178) * fVar230;
      fStack_1d4 = (fStack_1e4 * fVar253 + fStack_174) * fVar231;
      fStack_1d0 = (fStack_1e0 * fVar254 + fStack_170) * fVar232;
      fStack_1cc = (fStack_1dc * fVar255 + fStack_16c) * fVar239;
      local_1c8 = (local_1e8 * fVar192 + local_178) * fVar230;
      fStack_1c4 = (fStack_1e4 * fVar193 + fStack_174) * fVar231;
      fStack_1c0 = (fStack_1e0 * fVar170 + fStack_170) * fVar232;
      fStack_1bc = (fStack_1dc * fVar178 + fStack_16c) * fVar239;
      auVar248._0_4_ = (uint)fVar247 & uVar59;
      auVar248._4_4_ = (uint)fVar253 & uVar60;
      auVar248._8_4_ = (uint)fVar254 & uVar61;
      auVar248._12_4_ = (uint)fVar255 & uVar62;
      auVar236._0_8_ = CONCAT44(~uVar60,~uVar59) & 0x7f8000007f800000;
      auVar236._8_4_ = ~uVar61 & 0x7f800000;
      auVar236._12_4_ = ~uVar62 & 0x7f800000;
      auVar236 = auVar236 | auVar248;
      auVar275._0_4_ = (uint)fVar192 & uVar59;
      auVar275._4_4_ = (uint)fVar193 & uVar60;
      auVar275._8_4_ = (uint)fVar170 & uVar61;
      auVar275._12_4_ = (uint)fVar178 & uVar62;
      auVar249._0_8_ = CONCAT44(~uVar60,~uVar59) & 0xff800000ff800000;
      auVar249._8_4_ = ~uVar61 & 0xff800000;
      auVar249._12_4_ = ~uVar62 & 0xff800000;
      auVar249 = auVar249 | auVar275;
      auVar174._0_8_ = CONCAT44(fStack_404,local_408) & 0x7fffffff7fffffff;
      auVar174._8_4_ = ABS(fStack_400);
      auVar174._12_4_ = ABS(fStack_3fc);
      auVar23._4_4_ = fStack_354;
      auVar23._0_4_ = local_358;
      auVar23._8_4_ = fStack_350;
      auVar23._12_4_ = fStack_34c;
      auVar183 = maxps(auVar23,auVar174);
      fVar192 = auVar183._0_4_ * 1.9073486e-06;
      fVar193 = auVar183._4_4_ * 1.9073486e-06;
      fVar170 = auVar183._8_4_ * 1.9073486e-06;
      fVar178 = auVar183._12_4_ * 1.9073486e-06;
      auVar276._0_4_ = -(uint)(ABS(local_368) < fVar192 && bVar58);
      auVar276._4_4_ = -(uint)(ABS(fStack_364) < fVar193 && bVar9);
      auVar276._8_4_ = -(uint)(ABS(fStack_360) < fVar170 && bVar10);
      auVar276._12_4_ = -(uint)(ABS(fStack_35c) < fVar178 && bVar11);
      iVar44 = movmskps(iVar44,auVar276);
      if (iVar44 != 0) {
        uVar59 = -(uint)(auVar235._0_4_ <= 0.0);
        uVar60 = -(uint)(auVar235._4_4_ <= 0.0);
        uVar61 = -(uint)(auVar235._8_4_ <= 0.0);
        uVar62 = -(uint)(auVar235._12_4_ <= 0.0);
        auVar244._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar276._0_4_;
        auVar244._4_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar276._4_4_;
        auVar244._8_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar276._8_4_;
        auVar244._12_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar276._12_4_;
        auVar189._0_4_ = ~auVar276._0_4_ & auVar236._0_4_;
        auVar189._4_4_ = ~auVar276._4_4_ & auVar236._4_4_;
        auVar189._8_4_ = ~auVar276._8_4_ & auVar236._8_4_;
        auVar189._12_4_ = ~auVar276._12_4_ & auVar236._12_4_;
        auVar236 = auVar189 | auVar244;
        auVar237._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar276._0_4_;
        auVar237._4_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar276._4_4_;
        auVar237._8_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar276._8_4_;
        auVar237._12_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar276._12_4_;
        auVar279._0_4_ = ~auVar276._0_4_ & auVar249._0_4_;
        auVar279._4_4_ = ~auVar276._4_4_ & auVar249._4_4_;
        auVar279._8_4_ = ~auVar276._8_4_ & auVar249._8_4_;
        auVar279._12_4_ = ~auVar276._12_4_ & auVar249._12_4_;
        auVar249 = auVar279 | auVar237;
        auVar153._4_4_ = -(uint)((fVar193 <= ABS(fStack_364) || auVar235._4_4_ <= 0.0) && bVar9);
        auVar153._0_4_ = -(uint)((fVar192 <= ABS(local_368) || auVar235._0_4_ <= 0.0) && bVar58);
        auVar153._8_4_ = -(uint)((fVar170 <= ABS(fStack_360) || auVar235._8_4_ <= 0.0) && bVar10);
        auVar153._12_4_ = -(uint)((fVar178 <= ABS(fStack_35c) || auVar235._12_4_ <= 0.0) && bVar11);
      }
    }
    local_378._8_4_ = fVar232;
    local_378._0_8_ = CONCAT44(fVar231,fVar230);
    local_378._12_4_ = fVar239;
    auVar154._0_4_ = (auVar153._0_4_ << 0x1f) >> 0x1f;
    auVar154._4_4_ = (auVar153._4_4_ << 0x1f) >> 0x1f;
    auVar154._8_4_ = (auVar153._8_4_ << 0x1f) >> 0x1f;
    auVar154._12_4_ = (auVar153._12_4_ << 0x1f) >> 0x1f;
    auVar154 = auVar154 & local_1b8;
    iVar44 = movmskps(iVar44,auVar154);
    pauVar51 = (undefined1 (*) [16])CONCAT44(uVar52,iVar44);
    if (iVar44 != 0) {
      fVar192 = *(float *)(ray + k * 4 + 0x80);
      auVar201._0_4_ = fVar192 - (float)local_3d8._0_4_;
      auVar201._4_4_ = auVar201._0_4_;
      auVar201._8_4_ = auVar201._0_4_;
      auVar201._12_4_ = auVar201._0_4_;
      auVar202 = minps(auVar201,auVar249);
      auVar27._4_4_ = fStack_1a4;
      auVar27._0_4_ = local_1a8;
      auVar27._8_4_ = fStack_1a0;
      auVar27._12_4_ = fStack_19c;
      auVar199 = maxps(auVar27,auVar236);
      auVar140._0_4_ = local_468 * fVar149 + (float)local_478._0_4_ * fVar65;
      auVar140._4_4_ = fStack_464 * fVar149 + (float)local_478._4_4_ * fVar65;
      auVar140._8_4_ = fStack_460 * fVar149 + fStack_470 * fVar65;
      auVar140._12_4_ = fStack_45c * fVar149 + fStack_46c * fVar65;
      auVar281._0_4_ = fVar280 * local_4d8 + auVar140._0_4_;
      auVar281._4_4_ = local_4b8 * fStack_4d4 + auVar140._4_4_;
      auVar281._8_4_ = fStack_4b4 * fStack_4d0 + auVar140._8_4_;
      auVar281._12_4_ = fStack_4b0 * fStack_4cc + auVar140._12_4_;
      auVar183 = rcpps(auVar140,auVar281);
      fVar193 = auVar183._0_4_;
      fVar170 = auVar183._4_4_;
      fVar178 = auVar183._8_4_;
      fVar247 = auVar183._12_4_;
      fVar254 = (float)DAT_01f7ba10;
      fVar255 = DAT_01f7ba10._4_4_;
      fVar260 = DAT_01f7ba10._12_4_;
      fVar253 = DAT_01f7ba10._8_4_;
      fVar109 = ((fVar254 - auVar281._0_4_ * fVar193) * fVar193 + fVar193) *
                -((float)local_4a8._0_4_ * fVar280 +
                 fVar109 * local_468 + local_4c8 * (float)local_478._0_4_);
      fVar148 = ((fVar255 - auVar281._4_4_ * fVar170) * fVar170 + fVar170) *
                -((float)local_4a8._4_4_ * local_4b8 +
                 fVar148 * fStack_464 + fStack_4c4 * (float)local_478._4_4_);
      fVar168 = ((fVar253 - auVar281._8_4_ * fVar178) * fVar178 + fVar178) *
                -(fStack_4a0 * fStack_4b4 + fVar168 * fStack_460 + fStack_4c0 * fStack_470);
      fVar180 = ((fVar260 - auVar281._12_4_ * fVar247) * fVar247 + fVar247) *
                -(fStack_49c * fStack_4b0 + fVar180 * fStack_45c + fStack_4bc * fStack_46c);
      uVar59 = -(uint)(auVar281._0_4_ < 0.0 || ABS(auVar281._0_4_) < 1e-18);
      uVar60 = -(uint)(auVar281._4_4_ < 0.0 || ABS(auVar281._4_4_) < 1e-18);
      uVar61 = -(uint)(auVar281._8_4_ < 0.0 || ABS(auVar281._8_4_) < 1e-18);
      uVar62 = -(uint)(auVar281._12_4_ < 0.0 || ABS(auVar281._12_4_) < 1e-18);
      auVar141._0_8_ = CONCAT44(uVar60,uVar59) & 0xff800000ff800000;
      auVar141._8_4_ = uVar61 & 0xff800000;
      auVar141._12_4_ = uVar62 & 0xff800000;
      auVar89._0_4_ = ~uVar59 & (uint)fVar109;
      auVar89._4_4_ = ~uVar60 & (uint)fVar148;
      auVar89._8_4_ = ~uVar61 & (uint)fVar168;
      auVar89._12_4_ = ~uVar62 & (uint)fVar180;
      auVar199 = maxps(auVar199,auVar89 | auVar141);
      uVar59 = -(uint)(0.0 < auVar281._0_4_ || ABS(auVar281._0_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar281._4_4_ || ABS(auVar281._4_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar281._8_4_ || ABS(auVar281._8_4_) < 1e-18);
      uVar62 = -(uint)(0.0 < auVar281._12_4_ || ABS(auVar281._12_4_) < 1e-18);
      auVar90._0_8_ = CONCAT44(uVar60,uVar59) & 0x7f8000007f800000;
      auVar90._8_4_ = uVar61 & 0x7f800000;
      auVar90._12_4_ = uVar62 & 0x7f800000;
      auVar282._0_4_ = ~uVar59 & (uint)fVar109;
      auVar282._4_4_ = ~uVar60 & (uint)fVar148;
      auVar282._8_4_ = ~uVar61 & (uint)fVar168;
      auVar282._12_4_ = ~uVar62 & (uint)fVar180;
      auVar202 = minps(auVar202,auVar282 | auVar90);
      auVar142._0_4_ = (0.0 - fVar288) * -fStack_464 + (0.0 - fVar271) * -(float)local_478._4_4_;
      auVar142._4_4_ = (0.0 - fVar289) * -fStack_460 + (0.0 - fVar269) * -fStack_470;
      auVar142._8_4_ = (0.0 - fVar290) * -fStack_45c + (0.0 - fVar272) * -fStack_46c;
      auVar142._12_4_ = 0x80000000;
      auVar283._0_4_ =
           -local_4b8 * local_4d8 + -fStack_464 * fVar149 + -(float)local_478._4_4_ * fVar65;
      auVar283._4_4_ = -fStack_4b4 * fStack_4d4 + -fStack_460 * fVar149 + -fStack_470 * fVar65;
      auVar283._8_4_ = -fStack_4b0 * fStack_4d0 + -fStack_45c * fVar149 + -fStack_46c * fVar65;
      auVar283._12_4_ = fStack_4cc * -0.0 + fVar149 * -0.0 + fVar65 * -0.0;
      auVar183 = rcpps(auVar142,auVar283);
      fVar109 = auVar183._0_4_;
      fVar148 = auVar183._4_4_;
      fVar168 = auVar183._8_4_;
      fVar180 = auVar183._12_4_;
      fVar109 = ((fVar254 - auVar283._0_4_ * fVar109) * fVar109 + fVar109) *
                -((0.0 - fVar241) * -local_4b8 + auVar142._0_4_);
      fVar148 = ((fVar255 - auVar283._4_4_ * fVar148) * fVar148 + fVar148) *
                -((0.0 - fVar245) * -fStack_4b4 + auVar142._4_4_);
      fVar168 = ((fVar253 - auVar283._8_4_ * fVar168) * fVar168 + fVar168) *
                -((0.0 - fVar246) * -fStack_4b0 + auVar142._8_4_);
      fVar180 = ((fVar260 - auVar283._12_4_ * fVar180) * fVar180 + fVar180) * 0.0;
      uVar59 = -(uint)(auVar283._0_4_ < 0.0 || ABS(auVar283._0_4_) < 1e-18);
      uVar60 = -(uint)(auVar283._4_4_ < 0.0 || ABS(auVar283._4_4_) < 1e-18);
      uVar61 = -(uint)(auVar283._8_4_ < 0.0 || ABS(auVar283._8_4_) < 1e-18);
      uVar62 = -(uint)(auVar283._12_4_ < 0.0 || ABS(auVar283._12_4_) < 1e-18);
      auVar250._0_8_ = CONCAT44(uVar60,uVar59) & 0xff800000ff800000;
      auVar250._8_4_ = uVar61 & 0xff800000;
      auVar250._12_4_ = uVar62 & 0xff800000;
      auVar91._0_4_ = ~uVar59 & (uint)fVar109;
      auVar91._4_4_ = ~uVar60 & (uint)fVar148;
      auVar91._8_4_ = ~uVar61 & (uint)fVar168;
      auVar91._12_4_ = ~uVar62 & (uint)fVar180;
      auVar183 = maxps(auVar199,auVar91 | auVar250);
      uVar59 = -(uint)(0.0 < auVar283._0_4_ || ABS(auVar283._0_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar283._4_4_ || ABS(auVar283._4_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar283._8_4_ || ABS(auVar283._8_4_) < 1e-18);
      uVar62 = -(uint)(0.0 < auVar283._12_4_ || ABS(auVar283._12_4_) < 1e-18);
      auVar92._0_8_ = CONCAT44(uVar60,uVar59) & 0x7f8000007f800000;
      auVar92._8_4_ = uVar61 & 0x7f800000;
      auVar92._12_4_ = uVar62 & 0x7f800000;
      auVar284._0_4_ = ~uVar59 & (uint)fVar109;
      auVar284._4_4_ = ~uVar60 & (uint)fVar148;
      auVar284._8_4_ = ~uVar61 & (uint)fVar168;
      auVar284._12_4_ = ~uVar62 & (uint)fVar180;
      local_208 = minps(auVar202,auVar284 | auVar92);
      fVar109 = auVar183._0_4_;
      fVar148 = auVar183._4_4_;
      fVar168 = auVar183._8_4_;
      fVar180 = auVar183._12_4_;
      auVar186._0_4_ = -(uint)(fVar109 <= local_208._0_4_) & auVar154._0_4_;
      auVar186._4_4_ = -(uint)(fVar148 <= local_208._4_4_) & auVar154._4_4_;
      auVar186._8_4_ = -(uint)(fVar168 <= local_208._8_4_) & auVar154._8_4_;
      auVar186._12_4_ = -(uint)(fVar180 <= local_208._12_4_) & auVar154._12_4_;
      iVar44 = movmskps(iVar44,auVar186);
      pauVar51 = (undefined1 (*) [16])CONCAT44(uVar52,iVar44);
      if (iVar44 != 0) {
        auVar14._4_4_ = (auVar184._4_4_ - auVar73._4_4_) * 0.99999976;
        auVar14._0_4_ = (auVar184._0_4_ - auVar73._0_4_) * 0.99999976;
        auVar14._8_4_ = (auVar184._8_4_ - auVar73._8_4_) * 0.99999976;
        auVar14._12_4_ = (auVar184._12_4_ - auVar73._12_4_) * 0.99999976;
        auVar73 = maxps(ZEXT816(0),auVar14);
        auVar25._4_4_ = fStack_1d4;
        auVar25._0_4_ = local_1d8;
        auVar25._8_4_ = fStack_1d0;
        auVar25._12_4_ = fStack_1cc;
        auVar184 = minps(auVar25,_DAT_01f7ba10);
        auVar175._0_12_ = ZEXT812(0);
        auVar175._12_4_ = 0.0;
        auVar199 = maxps(auVar184,auVar175);
        auVar26._4_4_ = fStack_1c4;
        auVar26._0_4_ = local_1c8;
        auVar26._8_4_ = fStack_1c0;
        auVar26._12_4_ = fStack_1bc;
        auVar184 = minps(auVar26,_DAT_01f7ba10);
        auVar184 = maxps(auVar184,auVar175);
        local_108[0] = (auVar199._0_4_ + 0.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_108[1] = (auVar199._4_4_ + 1.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_108[2] = (auVar199._8_4_ + 2.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_108[3] = (auVar199._12_4_ + 3.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_118[0] = (auVar184._0_4_ + 0.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_118[1] = (auVar184._4_4_ + 1.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_118[2] = (auVar184._8_4_ + 2.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        local_118[3] = (auVar184._12_4_ + 3.0) * 0.25 * (float)local_5a8._4_4_ + local_198;
        fVar137 = fVar137 - auVar73._0_4_ * auVar73._0_4_;
        fVar150 = fVar150 - auVar73._4_4_ * auVar73._4_4_;
        fVar169 = fVar169 - auVar73._8_4_ * auVar73._8_4_;
        fVar191 = fVar191 - auVar73._12_4_ * auVar73._12_4_;
        auVar143._0_4_ = local_188 * local_188 - (float)local_4e8._0_4_ * fVar137;
        auVar143._4_4_ = fStack_184 * fStack_184 - (float)local_4e8._4_4_ * fVar150;
        auVar143._8_4_ = fStack_180 * fStack_180 - fStack_4e0 * fVar169;
        auVar143._12_4_ = fStack_17c * fStack_17c - fStack_4dc * fVar191;
        local_4e8._4_4_ = -(uint)(0.0 <= auVar143._4_4_);
        local_4e8._0_4_ = -(uint)(0.0 <= auVar143._0_4_);
        fStack_4e0 = (float)-(uint)(0.0 <= auVar143._8_4_);
        fStack_4dc = (float)-(uint)(0.0 <= auVar143._12_4_);
        iVar44 = movmskps(iVar44,_local_4e8);
        if (iVar44 == 0) {
          _local_5a8 = ZEXT816(0);
          fVar193 = 0.0;
          fVar170 = 0.0;
          fVar178 = 0.0;
          fVar240 = 0.0;
          local_698 = 0.0;
          fStack_694 = 0.0;
          fStack_690 = 0.0;
          fStack_68c = 0.0;
          fVar247 = 0.0;
          fVar253 = 0.0;
          fVar254 = 0.0;
          fVar255 = 0.0;
          _local_548 = ZEXT816(0);
          iVar44 = 0;
          auVar204 = _DAT_01f7aa00;
          auVar224 = _DAT_01f7a9f0;
        }
        else {
          auVar184 = sqrtps(_local_5a8,auVar143);
          auVar93._0_4_ = local_368 + local_368;
          auVar93._4_4_ = fStack_364 + fStack_364;
          auVar93._8_4_ = fStack_360 + fStack_360;
          auVar93._12_4_ = fStack_35c + fStack_35c;
          auVar73 = rcpps(auVar143,auVar93);
          fVar261 = auVar73._0_4_;
          fVar262 = auVar73._4_4_;
          fVar263 = auVar73._8_4_;
          fVar266 = auVar73._12_4_;
          fVar261 = (fVar254 - auVar93._0_4_ * fVar261) * fVar261 + fVar261;
          fVar262 = (fVar255 - auVar93._4_4_ * fVar262) * fVar262 + fVar262;
          fVar263 = (fVar253 - auVar93._8_4_ * fVar263) * fVar263 + fVar263;
          fVar266 = (fVar260 - auVar93._12_4_ * fVar266) * fVar266 + fVar266;
          fVar267 = (-local_188 - auVar184._0_4_) * fVar261;
          fVar270 = (-fStack_184 - auVar184._4_4_) * fVar262;
          fVar273 = (-fStack_180 - auVar184._8_4_) * fVar263;
          fVar280 = (-fStack_17c - auVar184._12_4_) * fVar266;
          fVar261 = (auVar184._0_4_ - local_188) * fVar261;
          fVar262 = (auVar184._4_4_ - fStack_184) * fVar262;
          fVar263 = (auVar184._8_4_ - fStack_180) * fVar263;
          fVar266 = (auVar184._12_4_ - fStack_17c) * fVar266;
          fVar193 = (local_1e8 * fVar267 + local_178) * fVar230;
          fVar170 = (fStack_1e4 * fVar270 + fStack_174) * fVar231;
          fVar178 = (fStack_1e0 * fVar273 + fStack_170) * fVar232;
          fVar260 = (fStack_1dc * fVar280 + fStack_16c) * fVar239;
          local_698 = local_4d8 * fVar267 - ((float)local_3f8._0_4_ * fVar193 + fVar240);
          fStack_694 = fStack_4d4 * fVar270 - ((float)local_3f8._4_4_ * fVar170 + fVar241);
          fStack_690 = fStack_4d0 * fVar273 - (fStack_3f0 * fVar178 + fVar245);
          fStack_68c = fStack_4cc * fVar280 - (fStack_3ec * fVar260 + fVar246);
          fVar247 = fVar149 * fVar267 - ((float)local_3e8._0_4_ * fVar193 + fVar285);
          fVar253 = fVar149 * fVar270 - ((float)local_3e8._4_4_ * fVar170 + fVar288);
          fVar254 = fVar149 * fVar273 - (fStack_3e0 * fVar178 + fVar289);
          fVar255 = fVar149 * fVar280 - (fStack_3dc * fVar260 + fVar290);
          local_548._4_4_ = fVar65 * fVar270 - (fVar170 * fVar205 + fVar271);
          local_548._0_4_ = fVar65 * fVar267 - (fVar193 * fVar179 + fVar268);
          fStack_540 = fVar65 * fVar273 - (fVar178 * fVar206 + fVar269);
          fStack_53c = fVar65 * fVar280 - (fVar260 * fVar207 + fVar272);
          fVar230 = (local_1e8 * fVar261 + local_178) * fVar230;
          fVar231 = (fStack_1e4 * fVar262 + fStack_174) * fVar231;
          fVar232 = (fStack_1e0 * fVar263 + fStack_170) * fVar232;
          fVar239 = (fStack_1dc * fVar266 + fStack_16c) * fVar239;
          local_5a8._4_4_ = fStack_4d4 * fVar262 - ((float)local_3f8._4_4_ * fVar231 + fVar241);
          local_5a8._0_4_ = local_4d8 * fVar261 - ((float)local_3f8._0_4_ * fVar230 + fVar240);
          fStack_5a0 = fStack_4d0 * fVar263 - (fStack_3f0 * fVar232 + fVar245);
          fStack_59c = fStack_4cc * fVar266 - (fStack_3ec * fVar239 + fVar246);
          fVar193 = fVar149 * fVar261 - ((float)local_3e8._0_4_ * fVar230 + fVar285);
          fVar170 = fVar149 * fVar262 - ((float)local_3e8._4_4_ * fVar231 + fVar288);
          fVar178 = fVar149 * fVar263 - (fStack_3e0 * fVar232 + fVar289);
          fVar240 = fVar149 * fVar266 - (fStack_3dc * fVar239 + fVar290);
          bVar58 = 0.0 <= auVar143._0_4_;
          uVar59 = -(uint)bVar58;
          bVar9 = 0.0 <= auVar143._4_4_;
          uVar60 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar143._8_4_;
          uVar61 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar143._12_4_;
          uVar62 = -(uint)bVar11;
          auVar175._0_4_ = fVar65 * fVar261 - (fVar230 * fVar179 + fVar268);
          auVar175._4_4_ = fVar65 * fVar262 - (fVar231 * fVar205 + fVar271);
          auVar175._8_4_ = fVar65 * fVar263 - (fVar232 * fVar206 + fVar269);
          auVar175._12_4_ = fVar65 * fVar266 - (fVar239 * fVar207 + fVar272);
          auVar203._0_4_ = (uint)fVar267 & uVar59;
          auVar203._4_4_ = (uint)fVar270 & uVar60;
          auVar203._8_4_ = (uint)fVar273 & uVar61;
          auVar203._12_4_ = (uint)fVar280 & uVar62;
          auVar224._0_8_ = CONCAT44(~uVar60,~uVar59) & 0x7f8000007f800000;
          auVar224._8_4_ = ~uVar61 & 0x7f800000;
          auVar224._12_4_ = ~uVar62 & 0x7f800000;
          auVar224 = auVar224 | auVar203;
          auVar187._0_4_ = (uint)fVar261 & uVar59;
          auVar187._4_4_ = (uint)fVar262 & uVar60;
          auVar187._8_4_ = (uint)fVar263 & uVar61;
          auVar187._12_4_ = (uint)fVar266 & uVar62;
          auVar204._0_8_ = CONCAT44(~uVar60,~uVar59) & 0xff800000ff800000;
          auVar204._8_4_ = ~uVar61 & 0xff800000;
          auVar204._12_4_ = ~uVar62 & 0xff800000;
          auVar204 = auVar204 | auVar187;
          auVar94._0_8_ = CONCAT44(fStack_404,local_408) & 0x7fffffff7fffffff;
          auVar94._8_4_ = ABS(fStack_400);
          auVar94._12_4_ = ABS(fStack_3fc);
          auVar24._4_4_ = fStack_354;
          auVar24._0_4_ = local_358;
          auVar24._8_4_ = fStack_350;
          auVar24._12_4_ = fStack_34c;
          auVar73 = maxps(auVar24,auVar94);
          fVar179 = auVar73._0_4_ * 1.9073486e-06;
          fVar205 = auVar73._4_4_ * 1.9073486e-06;
          fVar206 = auVar73._8_4_ * 1.9073486e-06;
          fVar207 = auVar73._12_4_ * 1.9073486e-06;
          auVar188._0_4_ = -(uint)(ABS(local_368) < fVar179 && bVar58);
          auVar188._4_4_ = -(uint)(ABS(fStack_364) < fVar205 && bVar9);
          auVar188._8_4_ = -(uint)(ABS(fStack_360) < fVar206 && bVar10);
          auVar188._12_4_ = -(uint)(ABS(fStack_35c) < fVar207 && bVar11);
          iVar44 = movmskps(iVar44,auVar188);
          if (iVar44 != 0) {
            uVar59 = -(uint)(fVar137 <= 0.0);
            uVar60 = -(uint)(fVar150 <= 0.0);
            uVar61 = -(uint)(fVar169 <= 0.0);
            uVar62 = -(uint)(fVar191 <= 0.0);
            auVar251._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar188._0_4_;
            auVar251._4_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar188._4_4_;
            auVar251._8_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar188._8_4_;
            auVar251._12_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar188._12_4_;
            auVar238._0_4_ = ~auVar188._0_4_ & auVar224._0_4_;
            auVar238._4_4_ = ~auVar188._4_4_ & auVar224._4_4_;
            auVar238._8_4_ = ~auVar188._8_4_ & auVar224._8_4_;
            auVar238._12_4_ = ~auVar188._12_4_ & auVar224._12_4_;
            auVar224 = auVar238 | auVar251;
            auVar252._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar188._0_4_;
            auVar252._4_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar188._4_4_;
            auVar252._8_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar188._8_4_;
            auVar252._12_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar188._12_4_;
            auVar190._0_4_ = ~auVar188._0_4_ & auVar204._0_4_;
            auVar190._4_4_ = ~auVar188._4_4_ & auVar204._4_4_;
            auVar190._8_4_ = ~auVar188._8_4_ & auVar204._8_4_;
            auVar190._12_4_ = ~auVar188._12_4_ & auVar204._12_4_;
            auVar204 = auVar190 | auVar252;
            local_4e8._4_4_ = -(uint)((fVar205 <= ABS(fStack_364) || fVar150 <= 0.0) && bVar9);
            local_4e8._0_4_ = -(uint)((fVar179 <= ABS(local_368) || fVar137 <= 0.0) && bVar58);
            fStack_4e0 = (float)-(uint)((fVar206 <= ABS(fStack_360) || fVar169 <= 0.0) && bVar10);
            fStack_4dc = (float)-(uint)((fVar207 <= ABS(fStack_35c) || fVar191 <= 0.0) && bVar11);
          }
        }
        fVar137 = (float)local_5a8._0_4_ * local_4d8;
        local_5a8._4_4_ = (float)local_5a8._4_4_ * fStack_4d4;
        fStack_5a0 = fStack_5a0 * fStack_4d0;
        fStack_59c = fStack_59c * fStack_4cc;
        _local_138 = auVar183;
        local_128 = minps(local_208,auVar224);
        auVar73 = maxps(auVar183,auVar204);
        local_218 = auVar73;
        local_3f8._0_4_ = -(uint)(fVar109 <= local_128._0_4_) & auVar186._0_4_;
        local_3f8._4_4_ = -(uint)(fVar148 <= local_128._4_4_) & auVar186._4_4_;
        fStack_3f0 = (float)(-(uint)(fVar168 <= local_128._8_4_) & auVar186._8_4_);
        fStack_3ec = (float)(-(uint)(fVar180 <= local_128._12_4_) & auVar186._12_4_);
        local_3e8 = (undefined1  [8])
                    CONCAT44(-(uint)(auVar73._4_4_ <= local_208._4_4_) & auVar186._4_4_,
                             -(uint)(auVar73._0_4_ <= local_208._0_4_) & auVar186._0_4_);
        fStack_3e0 = (float)(-(uint)(auVar73._8_4_ <= local_208._8_4_) & auVar186._8_4_);
        fStack_3dc = (float)(-(uint)(auVar73._12_4_ <= local_208._12_4_) & auVar186._12_4_);
        auVar120._8_4_ = fStack_3e0;
        auVar120._0_8_ = local_3e8;
        auVar120._12_4_ = fStack_3dc;
        iVar44 = movmskps(iVar44,auVar120 | _local_3f8);
        pauVar51 = (undefined1 (*) [16])CONCAT44(uVar52,iVar44);
        if (iVar44 != 0) {
          local_408 = (float)iVar53;
          fStack_404 = (float)iVar53;
          fStack_400 = (float)iVar53;
          fStack_3fc = (float)iVar53;
          local_548._0_4_ =
               -(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS((float)local_548._0_4_ * fVar65 +
                                                           fVar247 * fVar149 + local_698 * local_4d8
                                                          )) & local_4e8._0_4_) << 0x1f) >> 0x1f) +
                                4);
          local_548._4_4_ =
               -(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS((float)local_548._4_4_ * fVar65 +
                                                           fVar253 * fVar149 +
                                                           fStack_694 * fStack_4d4)) &
                                       local_4e8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_540 = (float)-(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS(fStack_540 * fVar65 +
                                                                          fVar254 * fVar149 +
                                                                          fStack_690 * fStack_4d0))
                                                      & (uint)fStack_4e0) << 0x1f) >> 0x1f) + 4);
          fStack_53c = (float)-(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS(fStack_53c * fVar65 +
                                                                          fVar255 * fVar149 +
                                                                          fStack_68c * fStack_4cc))
                                                      & (uint)fStack_4dc) << 0x1f) >> 0x1f) + 4);
          local_3b8 = ~_local_548 & _local_3f8;
          iVar44 = movmskps(iVar44,local_3b8);
          if (iVar44 != 0) {
            local_4c8 = fVar112 + fVar109;
            fStack_4c4 = fVar112 + fVar148;
            fStack_4c0 = fVar112 + fVar168;
            fStack_4bc = fVar112 + fVar180;
            do {
              auVar199 = ~local_3b8 & _DAT_01f7a9f0 | local_3b8 & auVar183;
              auVar155._4_4_ = auVar199._0_4_;
              auVar155._0_4_ = auVar199._4_4_;
              auVar155._8_4_ = auVar199._12_4_;
              auVar155._12_4_ = auVar199._8_4_;
              auVar184 = minps(auVar155,auVar199);
              auVar121._0_8_ = auVar184._8_8_;
              auVar121._8_4_ = auVar184._0_4_;
              auVar121._12_4_ = auVar184._4_4_;
              auVar184 = minps(auVar121,auVar184);
              auVar122._0_8_ =
                   CONCAT44(-(uint)(auVar184._4_4_ == auVar199._4_4_) & local_3b8._4_4_,
                            -(uint)(auVar184._0_4_ == auVar199._0_4_) & local_3b8._0_4_);
              auVar122._8_4_ = -(uint)(auVar184._8_4_ == auVar199._8_4_) & local_3b8._8_4_;
              auVar122._12_4_ = -(uint)(auVar184._12_4_ == auVar199._12_4_) & local_3b8._12_4_;
              iVar44 = movmskps(iVar44,auVar122);
              auVar95 = local_3b8;
              if (iVar44 != 0) {
                auVar95._8_4_ = auVar122._8_4_;
                auVar95._0_8_ = auVar122._0_8_;
                auVar95._12_4_ = auVar122._12_4_;
              }
              uVar45 = movmskps(iVar44,auVar95);
              lVar8 = 0;
              if (CONCAT44(uVar52,uVar45) != 0) {
                for (; (CONCAT44(uVar52,uVar45) >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              *(undefined4 *)(local_3b8 + lVar8 * 4) = 0;
              auVar21._4_4_ = fStack_414;
              auVar21._0_4_ = local_418;
              auVar21._8_4_ = fStack_410;
              auVar21._12_4_ = fStack_40c;
              auVar19._4_4_ = fStack_424;
              auVar19._0_4_ = local_428;
              auVar19._8_4_ = fStack_420;
              auVar19._12_4_ = fStack_41c;
              auVar199 = minps(auVar21,auVar19);
              auVar202 = maxps(auVar21,auVar19);
              auVar17._4_4_ = fStack_434;
              auVar17._0_4_ = local_438;
              auVar17._8_4_ = fStack_430;
              auVar17._12_4_ = fStack_42c;
              auVar15._4_4_ = fStack_444;
              auVar15._0_4_ = local_448;
              auVar15._8_4_ = fStack_440;
              auVar15._12_4_ = fStack_43c;
              auVar184 = minps(auVar17,auVar15);
              auVar199 = minps(auVar199,auVar184);
              auVar184 = maxps(auVar17,auVar15);
              auVar184 = maxps(auVar202,auVar184);
              auVar156._0_8_ = auVar199._0_8_ & 0x7fffffff7fffffff;
              auVar156._8_4_ = auVar199._8_4_ & 0x7fffffff;
              auVar156._12_4_ = auVar199._12_4_ & 0x7fffffff;
              local_4b8 = auVar184._12_4_;
              auVar96._0_8_ = auVar184._0_8_ & 0x7fffffff7fffffff;
              auVar96._8_4_ = auVar184._8_4_ & 0x7fffffff;
              auVar96._12_4_ = ABS(local_4b8);
              auVar184 = maxps(auVar156,auVar96);
              fVar109 = auVar184._4_4_;
              if (auVar184._4_4_ <= auVar184._0_4_) {
                fVar109 = auVar184._0_4_;
              }
              auVar157._8_8_ = auVar184._8_8_;
              auVar157._0_8_ = auVar184._8_8_;
              if (auVar184._8_4_ <= fVar109) {
                auVar157._0_4_ = fVar109;
              }
              fVar150 = auVar157._0_4_ * 1.9073486e-06;
              fStack_4b4 = local_4b8;
              fStack_4b0 = local_4b8;
              fStack_4ac = local_4b8;
              fVar109 = local_108[lVar8];
              fVar148 = *(float *)(local_138 + lVar8 * 4);
              bVar58 = true;
              uVar47 = 0;
              do {
                fVar180 = SQRT(fVar108) * 1.9073486e-06 * fVar148;
                fVar169 = 1.0 - fVar109;
                fVar192 = fVar109 * 3.0;
                fVar168 = -fVar109 * fVar169 * fVar169 * 0.5;
                fVar231 = (fVar109 * fVar109 * (fVar192 + -5.0) + 2.0) * 0.5;
                fVar230 = ((fVar169 * 3.0 + -5.0) * fVar169 * fVar169 + 2.0) * 0.5;
                fVar246 = -fVar169 * fVar109 * fVar109 * 0.5;
                fVar191 = fVar168 * fStack_40c +
                          fVar231 * fStack_41c + fVar230 * fStack_42c + fVar246 * fStack_43c;
                fVar206 = (fVar109 * (fVar169 + fVar169) - fVar169 * fVar169) * 0.5;
                fVar205 = ((fVar109 + fVar109) * (fVar192 + -5.0) + fVar109 * fVar192) * 0.5;
                fVar179 = ((fVar192 + 2.0) * (fVar169 + fVar169) + fVar169 * -3.0 * fVar169) * 0.5;
                fVar169 = (fVar169 * -2.0 * fVar109 + fVar109 * fVar109) * 0.5;
                fVar232 = fVar206 * local_418 +
                          fVar205 * local_428 + fVar179 * local_438 + fVar169 * local_448;
                fVar239 = fVar206 * fStack_414 +
                          fVar205 * fStack_424 + fVar179 * fStack_434 + fVar169 * fStack_444;
                fVar241 = fVar206 * fStack_410 +
                          fVar205 * fStack_420 + fVar179 * fStack_430 + fVar169 * fStack_440;
                fVar245 = fVar206 * fStack_40c +
                          fVar205 * fStack_41c + fVar179 * fStack_42c + fVar169 * fStack_43c;
                fVar179 = fVar109 * -3.0 + 2.0;
                fVar207 = fVar109 * 9.0 + -5.0;
                fVar169 = fVar109 * -9.0 + 4.0;
                fVar192 = fVar192 + -1.0;
                fVar205 = fVar179 * local_418 +
                          fVar207 * local_428 + fVar169 * local_438 + fVar192 * local_448;
                fVar206 = fVar179 * fStack_414 +
                          fVar207 * fStack_424 + fVar169 * fStack_434 + fVar192 * fStack_444;
                fVar207 = fVar179 * fStack_410 +
                          fVar207 * fStack_420 + fVar169 * fStack_430 + fVar192 * fStack_440;
                fVar192 = (fVar148 * (float)local_528._0_4_ + 0.0) -
                          (fVar168 * local_418 +
                          fVar231 * local_428 + fVar230 * local_438 + fVar246 * local_448);
                fVar179 = (fVar148 * (float)local_528._4_4_ + 0.0) -
                          (fVar168 * fStack_414 +
                          fVar231 * fStack_424 + fVar230 * fStack_434 + fVar246 * fStack_444);
                fVar230 = (fVar148 * fStack_520 + 0.0) -
                          (fVar168 * fStack_410 +
                          fVar231 * fStack_420 + fVar230 * fStack_430 + fVar246 * fStack_440);
                fVar169 = (fVar148 * fStack_51c + 0.0) - fVar191;
                fVar168 = fVar179 * fVar179;
                fStack_5d0 = fVar230 * fVar230;
                fStack_5cc = fVar169 * fVar169;
                local_5d8._0_4_ = fVar168 + fVar192 * fVar192 + fStack_5d0;
                local_5d8._4_4_ = fVar168 + fVar168 + fStack_5cc;
                fStack_5d0 = fVar168 + fStack_5d0 + fStack_5d0;
                fStack_5cc = fVar168 + fStack_5cc + fStack_5cc;
                fVar168 = fVar150;
                if (fVar150 <= fVar180) {
                  fVar168 = fVar180;
                }
                fVar247 = fVar239 * fVar239 + fVar232 * fVar232 + fVar241 * fVar241;
                auVar199 = ZEXT416((uint)fVar247);
                auVar184 = rsqrtss(ZEXT416((uint)fVar247),auVar199);
                fVar180 = auVar184._0_4_;
                fVar253 = fVar180 * 1.5 - fVar180 * fVar180 * fVar247 * 0.5 * fVar180;
                fVar262 = fVar232 * fVar253;
                fVar263 = fVar239 * fVar253;
                fVar266 = fVar241 * fVar253;
                fVar268 = fVar245 * fVar253;
                fVar260 = fVar207 * fVar241 + fVar206 * fVar239 + fVar205 * fVar232;
                auVar184 = rcpss(auVar199,auVar199);
                fVar246 = (2.0 - fVar247 * auVar184._0_4_) * auVar184._0_4_;
                fVar180 = fVar179 * fVar263;
                fVar254 = fVar230 * fVar266;
                fVar255 = fVar169 * fVar268;
                fVar231 = fVar180 + fVar192 * fVar262 + fVar254;
                fVar261 = fVar180 + fVar180 + fVar255;
                fVar254 = fVar180 + fVar254 + fVar254;
                fVar255 = fVar180 + fVar255 + fVar255;
                fVar180 = (SQRT((float)local_5d8._0_4_) + 1.0) * (fVar150 / SQRT(fVar247)) +
                          SQRT((float)local_5d8._0_4_) * fVar150 + fVar168;
                fStack_530 = fStack_520 * fVar266;
                fStack_534 = fStack_51c * fVar268;
                fVar268 = fVar268 * -fVar245;
                fVar260 = fVar266 * -fVar241 + fVar263 * -fVar239 + fVar262 * -fVar232 +
                          fVar246 * (fVar247 * fVar207 - fVar260 * fVar241) * fVar253 * fVar230 +
                          fVar246 * (fVar247 * fVar206 - fVar260 * fVar239) * fVar253 * fVar179 +
                          fVar246 * (fVar247 * fVar205 - fVar260 * fVar232) * fVar253 * fVar192;
                local_538 = fStack_530 +
                            (float)local_528._4_4_ * fVar263 + (float)local_528._0_4_ * fVar262;
                fVar246 = (float)local_5d8._0_4_ - fVar231 * fVar231;
                auVar97._0_8_ = CONCAT44((float)local_5d8._4_4_ - fVar261 * fVar261,fVar246);
                auVar97._8_4_ = fStack_5d0 - fVar254 * fVar254;
                auVar97._12_4_ = fStack_5cc - fVar255 * fVar255;
                fVar253 = -fVar241 * fVar230;
                fVar206 = -fVar245 * fVar169;
                fVar205 = (fVar253 + -fVar239 * fVar179 + -fVar232 * fVar192) - fVar231 * fVar260;
                fVar169 = fStack_51c * fVar169;
                fVar207 = (fStack_520 * fVar230 +
                          (float)local_528._4_4_ * fVar179 + (float)local_528._0_4_ * fVar192) -
                          fVar231 * local_538;
                auVar123._8_4_ = auVar97._8_4_;
                auVar123._0_8_ = auVar97._0_8_;
                auVar123._12_4_ = auVar97._12_4_;
                auVar184 = rsqrtss(auVar123,auVar97);
                fVar247 = auVar184._0_4_;
                auVar158._0_4_ = fVar247 * 1.5 - fVar247 * fVar247 * fVar246 * 0.5 * fVar247;
                auVar158._4_12_ = auVar184._4_12_;
                fStack_52c = fStack_534;
                if (fVar246 < 0.0) {
                  local_478._4_4_ = fVar206;
                  local_478._0_4_ = fVar205;
                  fStack_470 = fVar253;
                  fStack_46c = fVar206;
                  _local_4a8 = auVar158;
                  local_498 = fVar207;
                  fStack_494 = fVar169;
                  fStack_490 = fStack_520 * fVar230;
                  fStack_48c = fVar169;
                  local_488 = fVar231;
                  fStack_484 = fVar261;
                  fStack_480 = fVar254;
                  fStack_47c = fVar255;
                  local_468 = fVar180;
                  fVar246 = sqrtf(fVar246);
                  auVar158 = _local_4a8;
                  fVar180 = local_468;
                  fVar231 = local_488;
                  fVar205 = (float)local_478._0_4_;
                  fVar206 = (float)local_478._4_4_;
                  fVar207 = local_498;
                  fVar169 = fStack_494;
                }
                else {
                  fVar246 = SQRT(fVar246);
                }
                fVar246 = fVar246 - fVar191;
                fVar191 = fVar205 * auVar158._0_4_ - fVar245;
                fVar207 = fVar207 * auVar158._0_4_;
                auVar278._0_8_ = CONCAT44(fVar206,fVar191) ^ 0x8000000080000000;
                auVar177._4_4_ = fVar268;
                auVar177._0_4_ = fVar260;
                auVar159._0_4_ = fVar260 * fVar207 - local_538 * fVar191;
                auVar278._8_4_ = -fVar206;
                auVar278._12_4_ = fVar169;
                auVar277._8_8_ = auVar278._8_8_;
                auVar277._0_8_ = CONCAT44(fVar207,fVar191) ^ 0x80000000;
                auVar159._4_4_ = auVar159._0_4_;
                auVar159._8_4_ = auVar159._0_4_;
                auVar159._12_4_ = auVar159._0_4_;
                auVar199 = divps(auVar277,auVar159);
                auVar177._8_4_ = fVar268;
                auVar177._12_4_ = -fStack_534;
                auVar176._8_8_ = auVar177._8_8_;
                auVar176._0_8_ = CONCAT44(local_538,fVar260) ^ 0x8000000000000000;
                auVar184 = divps(auVar176,auVar159);
                fVar148 = fVar148 - (fVar246 * auVar184._0_4_ + fVar231 * auVar199._0_4_);
                fVar109 = fVar109 - (fVar246 * auVar184._4_4_ + fVar231 * auVar199._4_4_);
                if ((ABS(fVar231) < fVar180) &&
                   (ABS(fVar246) < local_4b8 * 1.9073486e-06 + fVar168 + fVar180)) {
                  fVar148 = (float)local_3d8._0_4_ + fVar148;
                  if ((fVar64 <= fVar148) &&
                     (fVar150 = *(float *)(ray + k * 4 + 0x80), fVar148 <= fVar150)) {
                    uVar48 = 0;
                    if ((fVar109 < 0.0) || (1.0 < fVar109)) goto LAB_00a818db;
                    auVar184 = rsqrtss(_local_5d8,_local_5d8);
                    fVar168 = auVar184._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_550].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar48 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar168 = fVar168 * 1.5 +
                                  fVar168 * fVar168 * (float)local_5d8._0_4_ * -0.5 * fVar168;
                        fVar192 = fVar192 * fVar168;
                        fVar179 = fVar179 * fVar168;
                        fVar230 = fVar230 * fVar168;
                        fVar168 = fVar245 * fVar192 + fVar232;
                        fVar169 = fVar245 * fVar179 + fVar239;
                        fVar180 = fVar245 * fVar230 + fVar241;
                        fVar191 = fVar179 * fVar232 - fVar239 * fVar192;
                        fVar179 = fVar230 * fVar239 - fVar241 * fVar179;
                        fVar192 = fVar192 * fVar241 - fVar232 * fVar230;
                        local_288 = fVar179 * fVar169 - fVar192 * fVar168;
                        local_2a8._4_4_ = fVar192 * fVar180 - fVar191 * fVar169;
                        local_298 = fVar191 * fVar168 - fVar179 * fVar180;
                        local_2a8._0_4_ = local_2a8._4_4_;
                        fStack_2a0 = (float)local_2a8._4_4_;
                        fStack_29c = (float)local_2a8._4_4_;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        fStack_284 = local_288;
                        fStack_280 = local_288;
                        fStack_27c = local_288;
                        local_278 = fVar109;
                        fStack_274 = fVar109;
                        fStack_270 = fVar109;
                        fStack_26c = fVar109;
                        local_268 = 0;
                        uStack_264 = 0;
                        uStack_260 = 0;
                        uStack_25c = 0;
                        local_258 = CONCAT44(uStack_394,local_398);
                        uStack_250 = CONCAT44(uStack_38c,uStack_390);
                        local_248 = CONCAT44(uStack_384,local_388);
                        uStack_240 = CONCAT44(uStack_37c,uStack_380);
                        local_238 = context->user->instID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        local_228 = context->user->instPrimID[0];
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        *(float *)(ray + k * 4 + 0x80) = fVar148;
                        local_568 = *local_450;
                        _local_518 = (int *)local_568;
                        uStack_510 = pGVar7->userPtr;
                        local_508 = context->user;
                        local_500 = ray;
                        local_4f8 = (RTCHitN *)local_2a8;
                        local_4f0 = 4;
                        p_Var50 = pGVar7->occlusionFilterN;
                        if (p_Var50 != (RTCFilterFunctionN)0x0) {
                          p_Var50 = (RTCFilterFunctionN)
                                    (*p_Var50)((RTCFilterFunctionNArguments *)local_518);
                        }
                        auVar124._0_4_ = -(uint)(local_568._0_4_ == 0);
                        auVar124._4_4_ = -(uint)(local_568._4_4_ == 0);
                        auVar124._8_4_ = -(uint)(local_568._8_4_ == 0);
                        auVar124._12_4_ = -(uint)(local_568._12_4_ == 0);
                        uVar59 = movmskps((int)p_Var50,auVar124);
                        pRVar49 = (RayK<4> *)(ulong)(uVar59 ^ 0xf);
                        if ((uVar59 ^ 0xf) == 0) {
                          auVar124 = auVar124 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var50 = context->args->filter;
                          if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var50)((RTCFilterFunctionNArguments *)local_518);
                          }
                          auVar98._0_4_ = -(uint)(local_568._0_4_ == 0);
                          auVar98._4_4_ = -(uint)(local_568._4_4_ == 0);
                          auVar98._8_4_ = -(uint)(local_568._8_4_ == 0);
                          auVar98._12_4_ = -(uint)(local_568._12_4_ == 0);
                          auVar124 = auVar98 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_500 + 0x80) =
                               ~auVar98 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_500 + 0x80) & auVar98;
                          pRVar49 = local_500;
                        }
                        auVar125._0_4_ = auVar124._0_4_ << 0x1f;
                        auVar125._4_4_ = auVar124._4_4_ << 0x1f;
                        auVar125._8_4_ = auVar124._8_4_ << 0x1f;
                        auVar125._12_4_ = auVar124._12_4_ << 0x1f;
                        iVar44 = movmskps((int)pRVar49,auVar125);
                        uVar48 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar49 >> 0x20),iVar44) >> 8
                                                ),iVar44 != 0);
                        if (iVar44 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar150;
                        }
                      }
                      goto LAB_00a818db;
                    }
                  }
                  uVar48 = 0;
                  goto LAB_00a818db;
                }
                bVar58 = uVar47 < 4;
                uVar47 = uVar47 + 1;
              } while (uVar47 != 5);
              bVar58 = false;
              uVar48 = 5;
LAB_00a818db:
              fVar192 = *(float *)(ray + k * 4 + 0x80);
              local_3b8._0_4_ = -(uint)(local_4c8 <= fVar192) & local_3b8._0_4_;
              local_3b8._4_4_ = -(uint)(fStack_4c4 <= fVar192) & local_3b8._4_4_;
              local_3b8._8_4_ = -(uint)(fStack_4c0 <= fVar192) & local_3b8._8_4_;
              local_3b8._12_4_ = -(uint)(fStack_4bc <= fVar192) & local_3b8._12_4_;
              bVar55 = (bool)(bVar55 | bVar58 & (byte)uVar48);
              uVar52 = (undefined4)((ulong)uVar48 >> 0x20);
              iVar44 = movmskps((int)uVar48,local_3b8);
            } while (iVar44 != 0);
          }
          auVar126._0_4_ = -(uint)(auVar73._0_4_ + fVar112 <= fVar192) & local_3e8._0_4_;
          auVar126._4_4_ = -(uint)(auVar73._4_4_ + fVar112 <= fVar192) & local_3e8._4_4_;
          auVar126._8_4_ = -(uint)(auVar73._8_4_ + fVar112 <= fVar192) & (uint)fStack_3e0;
          auVar126._12_4_ = -(uint)(auVar73._12_4_ + fVar112 <= fVar192) & (uint)fStack_3dc;
          auVar99._0_4_ =
               -(uint)((int)local_408 <
                      ((int)((-(uint)(0.3 <= ABS(fVar137 + fVar193 * fVar149 +
                                                           auVar175._0_4_ * fVar65)) &
                             local_4e8._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar99._4_4_ =
               -(uint)((int)fStack_404 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._4_4_ +
                                                 fVar170 * fVar149 + auVar175._4_4_ * fVar65)) &
                             local_4e8._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar99._8_4_ =
               -(uint)((int)fStack_400 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5a0 +
                                                 fVar178 * fVar149 + auVar175._8_4_ * fVar65)) &
                             (uint)fStack_4e0) << 0x1f) >> 0x1f) + 4);
          auVar99._12_4_ =
               -(uint)((int)fStack_3fc <
                      ((int)((-(uint)(0.3 <= ABS(fStack_59c +
                                                 fVar240 * fVar149 + auVar175._12_4_ * fVar65)) &
                             (uint)fStack_4dc) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~auVar99 & auVar126;
          iVar44 = movmskps(0,local_3c8);
          if (iVar44 != 0) {
            fVar109 = local_218._0_4_;
            fVar137 = local_218._4_4_;
            fVar148 = local_218._8_4_;
            fVar150 = local_218._12_4_;
            local_4c8 = fVar112 + fVar109;
            fStack_4c4 = fVar112 + fVar137;
            fStack_4c0 = fVar112 + fVar148;
            fStack_4bc = fVar112 + fVar150;
            do {
              uVar59 = local_3c8._0_4_;
              uVar60 = local_3c8._4_4_;
              uVar61 = local_3c8._8_4_;
              uVar62 = local_3c8._12_4_;
              auVar127._0_4_ = uVar59 & (uint)fVar109;
              auVar127._4_4_ = uVar60 & (uint)fVar137;
              auVar127._8_4_ = uVar61 & (uint)fVar148;
              auVar127._12_4_ = uVar62 & (uint)fVar150;
              auVar144._0_8_ = CONCAT44(~uVar60,~uVar59) & 0x7f8000007f800000;
              auVar144._8_4_ = ~uVar61 & 0x7f800000;
              auVar144._12_4_ = ~uVar62 & 0x7f800000;
              auVar144 = auVar144 | auVar127;
              auVar160._4_4_ = auVar144._0_4_;
              auVar160._0_4_ = auVar144._4_4_;
              auVar160._8_4_ = auVar144._12_4_;
              auVar160._12_4_ = auVar144._8_4_;
              auVar73 = minps(auVar160,auVar144);
              auVar128._0_8_ = auVar73._8_8_;
              auVar128._8_4_ = auVar73._0_4_;
              auVar128._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar128,auVar73);
              auVar129._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar144._4_4_) & uVar60,
                            -(uint)(auVar73._0_4_ == auVar144._0_4_) & uVar59);
              auVar129._8_4_ = -(uint)(auVar73._8_4_ == auVar144._8_4_) & uVar61;
              auVar129._12_4_ = -(uint)(auVar73._12_4_ == auVar144._12_4_) & uVar62;
              iVar44 = movmskps(iVar44,auVar129);
              auVar100 = local_3c8;
              if (iVar44 != 0) {
                auVar100._8_4_ = auVar129._8_4_;
                auVar100._0_8_ = auVar129._0_8_;
                auVar100._12_4_ = auVar129._12_4_;
              }
              uVar45 = movmskps(iVar44,auVar100);
              lVar8 = 0;
              if (CONCAT44(uVar52,uVar45) != 0) {
                for (; (CONCAT44(uVar52,uVar45) >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + lVar8 * 4) = 0;
              auVar22._4_4_ = fStack_414;
              auVar22._0_4_ = local_418;
              auVar22._8_4_ = fStack_410;
              auVar22._12_4_ = fStack_40c;
              auVar20._4_4_ = fStack_424;
              auVar20._0_4_ = local_428;
              auVar20._8_4_ = fStack_420;
              auVar20._12_4_ = fStack_41c;
              auVar183 = minps(auVar22,auVar20);
              auVar184 = maxps(auVar22,auVar20);
              auVar18._4_4_ = fStack_434;
              auVar18._0_4_ = local_438;
              auVar18._8_4_ = fStack_430;
              auVar18._12_4_ = fStack_42c;
              auVar16._4_4_ = fStack_444;
              auVar16._0_4_ = local_448;
              auVar16._8_4_ = fStack_440;
              auVar16._12_4_ = fStack_43c;
              auVar73 = minps(auVar18,auVar16);
              auVar183 = minps(auVar183,auVar73);
              auVar73 = maxps(auVar18,auVar16);
              auVar73 = maxps(auVar184,auVar73);
              auVar161._0_8_ = auVar183._0_8_ & 0x7fffffff7fffffff;
              auVar161._8_4_ = auVar183._8_4_ & 0x7fffffff;
              auVar161._12_4_ = auVar183._12_4_ & 0x7fffffff;
              local_4b8 = auVar73._12_4_;
              auVar101._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
              auVar101._8_4_ = auVar73._8_4_ & 0x7fffffff;
              auVar101._12_4_ = ABS(local_4b8);
              auVar73 = maxps(auVar161,auVar101);
              uVar48 = auVar73._8_8_;
              fVar168 = auVar73._4_4_;
              if (auVar73._4_4_ <= auVar73._0_4_) {
                fVar168 = auVar73._0_4_;
              }
              auVar162._8_8_ = uVar48;
              auVar162._0_8_ = uVar48;
              if (auVar73._8_4_ <= fVar168) {
                auVar163._4_12_ = auVar162._4_12_;
                auVar163._0_4_ = fVar168;
                uVar48 = auVar163._0_8_;
              }
              fVar180 = (float)uVar48 * 1.9073486e-06;
              fStack_4b4 = local_4b8;
              fStack_4b0 = local_4b8;
              fStack_4ac = local_4b8;
              fVar168 = local_118[lVar8];
              fVar169 = *(float *)(local_208 + lVar8 * 4);
              bVar58 = true;
              uVar47 = 0;
              do {
                fVar193 = SQRT(fVar108) * 1.9073486e-06 * fVar169;
                fVar192 = 1.0 - fVar168;
                fVar178 = fVar168 * 3.0;
                fVar191 = -fVar168 * fVar192 * fVar192 * 0.5;
                fVar231 = (fVar168 * fVar168 * (fVar178 + -5.0) + 2.0) * 0.5;
                fVar230 = ((fVar192 * 3.0 + -5.0) * fVar192 * fVar192 + 2.0) * 0.5;
                fVar232 = -fVar192 * fVar168 * fVar168 * 0.5;
                fVar170 = fVar191 * fStack_40c +
                          fVar231 * fStack_41c + fVar230 * fStack_42c + fVar232 * fStack_43c;
                fVar206 = (fVar168 * (fVar192 + fVar192) - fVar192 * fVar192) * 0.5;
                fVar205 = ((fVar168 + fVar168) * (fVar178 + -5.0) + fVar168 * fVar178) * 0.5;
                fVar179 = ((fVar178 + 2.0) * (fVar192 + fVar192) + fVar192 * -3.0 * fVar192) * 0.5;
                fVar192 = (fVar192 * -2.0 * fVar168 + fVar168 * fVar168) * 0.5;
                fVar239 = fVar206 * local_418 +
                          fVar205 * local_428 + fVar179 * local_438 + fVar192 * local_448;
                fVar240 = fVar206 * fStack_414 +
                          fVar205 * fStack_424 + fVar179 * fStack_434 + fVar192 * fStack_444;
                fVar241 = fVar206 * fStack_410 +
                          fVar205 * fStack_420 + fVar179 * fStack_430 + fVar192 * fStack_440;
                fVar245 = fVar206 * fStack_40c +
                          fVar205 * fStack_41c + fVar179 * fStack_42c + fVar192 * fStack_43c;
                fVar179 = fVar168 * -3.0 + 2.0;
                fVar207 = fVar168 * 9.0 + -5.0;
                fVar192 = fVar168 * -9.0 + 4.0;
                fVar178 = fVar178 + -1.0;
                fVar205 = fVar179 * local_418 +
                          fVar207 * local_428 + fVar192 * local_438 + fVar178 * local_448;
                fVar206 = fVar179 * fStack_414 +
                          fVar207 * fStack_424 + fVar192 * fStack_434 + fVar178 * fStack_444;
                fVar207 = fVar179 * fStack_410 +
                          fVar207 * fStack_420 + fVar192 * fStack_430 + fVar178 * fStack_440;
                fVar178 = (fVar169 * (float)local_528._0_4_ + 0.0) -
                          (fVar191 * local_418 +
                          fVar231 * local_428 + fVar230 * local_438 + fVar232 * local_448);
                fVar179 = (fVar169 * (float)local_528._4_4_ + 0.0) -
                          (fVar191 * fStack_414 +
                          fVar231 * fStack_424 + fVar230 * fStack_434 + fVar232 * fStack_444);
                fVar230 = (fVar169 * fStack_520 + 0.0) -
                          (fVar191 * fStack_410 +
                          fVar231 * fStack_420 + fVar230 * fStack_430 + fVar232 * fStack_440);
                fVar192 = (fVar169 * fStack_51c + 0.0) - fVar170;
                fVar191 = fVar179 * fVar179;
                fStack_5e0 = fVar230 * fVar230;
                fStack_5dc = fVar192 * fVar192;
                local_5e8._0_4_ = fVar191 + fVar178 * fVar178 + fStack_5e0;
                local_5e8._4_4_ = fVar191 + fVar191 + fStack_5dc;
                fStack_5e0 = fVar191 + fStack_5e0 + fStack_5e0;
                fStack_5dc = fVar191 + fStack_5dc + fStack_5dc;
                fVar191 = fVar180;
                if (fVar180 <= fVar193) {
                  fVar191 = fVar193;
                }
                fVar232 = fVar240 * fVar240 + fVar239 * fVar239 + fVar241 * fVar241;
                auVar183 = ZEXT416((uint)fVar232);
                auVar73 = rsqrtss(ZEXT416((uint)fVar232),auVar183);
                fVar193 = auVar73._0_4_;
                fVar246 = fVar193 * 1.5 - fVar193 * fVar193 * fVar232 * 0.5 * fVar193;
                fVar253 = fVar239 * fVar246;
                fVar254 = fVar240 * fVar246;
                fVar255 = fVar241 * fVar246;
                fVar260 = fVar245 * fVar246;
                fVar247 = fVar207 * fVar241 + fVar206 * fVar240 + fVar205 * fVar239;
                auVar73 = rcpss(auVar183,auVar183);
                fVar193 = (2.0 - fVar232 * auVar73._0_4_) * auVar73._0_4_;
                fVar231 = fVar179 * fVar254;
                fStack_530 = fVar230 * fVar255;
                fStack_52c = fVar192 * fVar260;
                local_538 = fVar231 + fVar178 * fVar253 + fStack_530;
                fStack_534 = fVar231 + fVar231 + fStack_52c;
                fStack_530 = fVar231 + fStack_530 + fStack_530;
                fStack_52c = fVar231 + fStack_52c + fStack_52c;
                fVar261 = (SQRT((float)local_5e8._0_4_) + 1.0) * (fVar180 / SQRT(fVar232)) +
                          SQRT((float)local_5e8._0_4_) * fVar180 + fVar191;
                fVar231 = fStack_51c * fVar260;
                auVar225._0_4_ = fVar253 * -fVar239;
                auVar225._4_4_ = fVar254 * -fVar240;
                auVar225._8_4_ = fVar255 * -fVar241;
                auVar225._12_4_ = fVar260 * -fVar245;
                auVar226._8_8_ = auVar225._8_8_;
                auVar226._0_8_ = auVar226._8_8_;
                auVar227._4_12_ = auVar226._4_12_;
                auVar227._0_4_ =
                     auVar225._8_4_ + auVar225._4_4_ + auVar225._0_4_ +
                     fVar193 * (fVar232 * fVar207 - fVar247 * fVar241) * fVar246 * fVar230 +
                     fVar193 * (fVar232 * fVar206 - fVar247 * fVar240) * fVar246 * fVar179 +
                     fVar193 * (fVar232 * fVar205 - fVar247 * fVar239) * fVar246 * fVar178;
                fVar193 = fStack_520 * fVar255 +
                          (float)local_528._4_4_ * fVar254 + (float)local_528._0_4_ * fVar253;
                fVar232 = (float)local_5e8._0_4_ - local_538 * local_538;
                auVar102._0_8_ = CONCAT44((float)local_5e8._4_4_ - fStack_534 * fStack_534,fVar232);
                auVar102._8_4_ = fStack_5e0 - fStack_530 * fStack_530;
                auVar102._12_4_ = fStack_5dc - fStack_52c * fStack_52c;
                fVar247 = -fVar241 * fVar230;
                fVar207 = -fVar245 * fVar192;
                fVar206 = (fVar247 + -fVar240 * fVar179 + -fVar239 * fVar178) -
                          local_538 * auVar227._0_4_;
                fVar192 = fStack_51c * fVar192;
                fVar205 = (fStack_520 * fVar230 +
                          (float)local_528._4_4_ * fVar179 + (float)local_528._0_4_ * fVar178) -
                          local_538 * fVar193;
                auVar130._8_4_ = auVar102._8_4_;
                auVar130._0_8_ = auVar102._0_8_;
                auVar130._12_4_ = auVar102._12_4_;
                auVar73 = rsqrtss(auVar130,auVar102);
                fVar246 = auVar73._0_4_;
                auVar164._0_4_ = fVar246 * 1.5 - fVar246 * fVar246 * fVar232 * 0.5 * fVar246;
                auVar164._4_12_ = auVar73._4_12_;
                if (fVar232 < 0.0) {
                  _local_4a8 = auVar164;
                  local_498 = fVar205;
                  fStack_494 = fVar192;
                  fStack_490 = fStack_520 * fVar230;
                  fStack_48c = fVar192;
                  local_488 = fVar193;
                  fStack_484 = fVar231;
                  fStack_480 = fStack_520 * fVar255;
                  fStack_47c = fVar231;
                  _local_478 = auVar227;
                  local_468 = fVar206;
                  fStack_464 = fVar207;
                  fStack_460 = fVar247;
                  fStack_45c = fVar207;
                  fVar232 = sqrtf(fVar232);
                  auVar164 = _local_4a8;
                  auVar208 = local_478;
                  fVar193 = local_488;
                  fVar231 = fStack_484;
                  fVar205 = local_498;
                  fVar192 = fStack_494;
                  fVar206 = local_468;
                  fVar207 = fStack_464;
                }
                else {
                  fVar232 = SQRT(fVar232);
                  auVar208 = (undefined1  [8])auVar227._0_8_;
                }
                fVar232 = fVar232 - fVar170;
                fVar170 = fVar206 * auVar164._0_4_ - fVar245;
                fVar205 = fVar205 * auVar164._0_4_;
                auVar287._0_8_ = CONCAT44(fVar207,fVar170) ^ 0x8000000080000000;
                auVar165._0_4_ = SUB84(auVar208,0) * fVar205 - fVar193 * fVar170;
                auVar287._8_4_ = -fVar207;
                auVar287._12_4_ = fVar192;
                auVar286._8_8_ = auVar287._8_8_;
                auVar286._0_8_ = CONCAT44(fVar205,fVar170) ^ 0x80000000;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar183 = divps(auVar286,auVar165);
                auVar229._8_4_ = (int)((ulong)auVar208 >> 0x20);
                auVar229._0_8_ = auVar208;
                auVar229._12_4_ = -fVar231;
                auVar228._8_8_ = auVar229._8_8_;
                auVar228._0_8_ = CONCAT44(fVar193,SUB84(auVar208,0)) ^ 0x8000000000000000;
                auVar73 = divps(auVar228,auVar165);
                fVar169 = fVar169 - (fVar232 * auVar73._0_4_ + local_538 * auVar183._0_4_);
                fVar168 = fVar168 - (fVar232 * auVar73._4_4_ + local_538 * auVar183._4_4_);
                if ((ABS(local_538) < fVar261) &&
                   (ABS(fVar232) < local_4b8 * 1.9073486e-06 + fVar191 + fVar261)) {
                  fVar169 = (float)local_3d8._0_4_ + fVar169;
                  if (fVar169 < fVar64) {
                    uVar48 = 0;
                    goto LAB_00a823db;
                  }
                  fVar180 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar169 <= fVar180) {
                    uVar48 = 0;
                    if ((fVar168 < 0.0) || (1.0 < fVar168)) goto LAB_00a823db;
                    auVar73 = rsqrtss(_local_5e8,_local_5e8);
                    fVar191 = auVar73._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_550].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar48 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar191 = fVar191 * 1.5 +
                                  fVar191 * fVar191 * (float)local_5e8._0_4_ * -0.5 * fVar191;
                        fVar178 = fVar178 * fVar191;
                        fVar179 = fVar179 * fVar191;
                        fVar230 = fVar230 * fVar191;
                        fVar191 = fVar245 * fVar178 + fVar239;
                        fVar192 = fVar245 * fVar179 + fVar240;
                        fVar193 = fVar245 * fVar230 + fVar241;
                        fVar170 = fVar179 * fVar239 - fVar240 * fVar178;
                        fVar179 = fVar230 * fVar240 - fVar241 * fVar179;
                        fVar178 = fVar178 * fVar241 - fVar239 * fVar230;
                        local_288 = fVar179 * fVar192 - fVar178 * fVar191;
                        local_2a8._4_4_ = fVar178 * fVar193 - fVar170 * fVar192;
                        local_298 = fVar170 * fVar191 - fVar179 * fVar193;
                        local_2a8._0_4_ = local_2a8._4_4_;
                        fStack_2a0 = (float)local_2a8._4_4_;
                        fStack_29c = (float)local_2a8._4_4_;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        fStack_284 = local_288;
                        fStack_280 = local_288;
                        fStack_27c = local_288;
                        local_278 = fVar168;
                        fStack_274 = fVar168;
                        fStack_270 = fVar168;
                        fStack_26c = fVar168;
                        local_268 = 0;
                        uStack_264 = 0;
                        uStack_260 = 0;
                        uStack_25c = 0;
                        local_258 = CONCAT44(uStack_394,local_398);
                        uStack_250 = CONCAT44(uStack_38c,uStack_390);
                        local_248 = CONCAT44(uStack_384,local_388);
                        uStack_240 = CONCAT44(uStack_37c,uStack_380);
                        local_238 = context->user->instID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        local_228 = context->user->instPrimID[0];
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        *(float *)(ray + k * 4 + 0x80) = fVar169;
                        local_568 = *local_450;
                        _local_518 = (int *)local_568;
                        uStack_510 = pGVar7->userPtr;
                        local_508 = context->user;
                        local_500 = ray;
                        local_4f8 = (RTCHitN *)local_2a8;
                        local_4f0 = 4;
                        p_Var50 = pGVar7->occlusionFilterN;
                        if (p_Var50 != (RTCFilterFunctionN)0x0) {
                          p_Var50 = (RTCFilterFunctionN)
                                    (*p_Var50)((RTCFilterFunctionNArguments *)local_518);
                        }
                        auVar131._0_4_ = -(uint)(local_568._0_4_ == 0);
                        auVar131._4_4_ = -(uint)(local_568._4_4_ == 0);
                        auVar131._8_4_ = -(uint)(local_568._8_4_ == 0);
                        auVar131._12_4_ = -(uint)(local_568._12_4_ == 0);
                        uVar59 = movmskps((int)p_Var50,auVar131);
                        pRVar49 = (RayK<4> *)(ulong)(uVar59 ^ 0xf);
                        if ((uVar59 ^ 0xf) == 0) {
                          auVar131 = auVar131 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var50 = context->args->filter;
                          if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var50)((RTCFilterFunctionNArguments *)local_518);
                          }
                          auVar103._0_4_ = -(uint)(local_568._0_4_ == 0);
                          auVar103._4_4_ = -(uint)(local_568._4_4_ == 0);
                          auVar103._8_4_ = -(uint)(local_568._8_4_ == 0);
                          auVar103._12_4_ = -(uint)(local_568._12_4_ == 0);
                          auVar131 = auVar103 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_500 + 0x80) =
                               ~auVar103 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_500 + 0x80) & auVar103;
                          pRVar49 = local_500;
                        }
                        auVar132._0_4_ = auVar131._0_4_ << 0x1f;
                        auVar132._4_4_ = auVar131._4_4_ << 0x1f;
                        auVar132._8_4_ = auVar131._8_4_ << 0x1f;
                        auVar132._12_4_ = auVar131._12_4_ << 0x1f;
                        iVar44 = movmskps((int)pRVar49,auVar132);
                        uVar48 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar49 >> 0x20),iVar44) >> 8
                                                ),iVar44 != 0);
                        if (iVar44 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar180;
                        }
                      }
                      goto LAB_00a823db;
                    }
                  }
                  uVar48 = 0;
                  goto LAB_00a823db;
                }
                bVar58 = uVar47 < 4;
                uVar47 = uVar47 + 1;
              } while (uVar47 != 5);
              bVar58 = false;
              uVar48 = 5;
LAB_00a823db:
              fVar192 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_4c8 <= fVar192) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_4c4 <= fVar192) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_4c0 <= fVar192) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_4bc <= fVar192) & local_3c8._12_4_;
              bVar55 = (bool)(bVar55 | bVar58 & (byte)uVar48);
              uVar52 = (undefined4)((ulong)uVar48 >> 0x20);
              iVar44 = movmskps((int)uVar48,local_3c8);
            } while (iVar44 != 0);
            iVar44 = 0;
          }
          auVar166._0_4_ =
               local_548._0_4_ & local_3f8._0_4_ &
               -(uint)(fVar112 + (float)local_138._0_4_ <= fVar192);
          auVar166._4_4_ =
               local_548._4_4_ & local_3f8._4_4_ &
               -(uint)(fVar112 + (float)local_138._4_4_ <= fVar192);
          auVar166._8_4_ =
               (uint)fStack_540 & (uint)fStack_3f0 & -(uint)(fVar112 + fStack_130 <= fVar192);
          auVar166._12_4_ =
               (uint)fStack_53c & (uint)fStack_3ec & -(uint)(fVar112 + fStack_12c <= fVar192);
          auVar145._0_4_ =
               auVar99._0_4_ & auVar126._0_4_ & -(uint)(fVar112 + local_218._0_4_ <= fVar192);
          auVar145._4_4_ =
               auVar99._4_4_ & auVar126._4_4_ & -(uint)(fVar112 + local_218._4_4_ <= fVar192);
          auVar145._8_4_ =
               auVar99._8_4_ & auVar126._8_4_ & -(uint)(fVar112 + local_218._8_4_ <= fVar192);
          auVar145._12_4_ =
               auVar99._12_4_ & auVar126._12_4_ & -(uint)(fVar112 + local_218._12_4_ <= fVar192);
          uVar59 = movmskps(iVar44,auVar145 | auVar166);
          pauVar51 = (undefined1 (*) [16])(ulong)uVar59;
          if (uVar59 != 0) {
            pauVar51 = (undefined1 (*) [16])(uVar56 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar51) = auVar145 | auVar166;
            auStack_e8[uVar56 * 0xc] =
                 ~auVar166._0_4_ & (uint)local_218._0_4_ | local_138._0_4_ & auVar166._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar51[-0xf]) =
                 ~auVar166._4_4_ & (uint)local_218._4_4_ | local_138._4_4_ & auVar166._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar51[-0xe]) =
                 ~auVar166._8_4_ & (uint)local_218._8_4_ | (uint)fStack_130 & auVar166._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar51[-0xe]) =
                 ~auVar166._12_4_ & (uint)local_218._12_4_ | (uint)fStack_12c & auVar166._12_4_;
            (&uStack_d8)[uVar56 * 6] = CONCAT44(fStack_194,local_198);
            aiStack_d0[uVar56 * 0xc] = iVar53 + 1;
            iVar57 = iVar57 + 1;
          }
        }
      }
    }
    if (iVar57 == 0) break;
    fVar109 = *(float *)(ray + k * 4 + 0x80);
    uVar60 = -iVar57;
    pauVar51 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar57 - 1) * 0x30);
    uVar59 = uVar60;
    while( true ) {
      auVar133._0_4_ = -(uint)(fVar112 + *(float *)pauVar51[1] <= fVar109) & *(uint *)*pauVar51;
      auVar133._4_4_ =
           -(uint)(fVar112 + *(float *)(pauVar51[1] + 4) <= fVar109) & *(uint *)(*pauVar51 + 4);
      auVar133._8_4_ =
           -(uint)(fVar112 + *(float *)(pauVar51[1] + 8) <= fVar109) & *(uint *)(*pauVar51 + 8);
      auVar133._12_4_ =
           -(uint)(fVar112 + *(float *)(pauVar51[1] + 0xc) <= fVar109) & *(uint *)(*pauVar51 + 0xc);
      _local_2a8 = auVar133;
      iVar53 = movmskps(uVar59,auVar133);
      if (iVar53 != 0) break;
      pauVar51 = pauVar51 + -3;
      uVar60 = uVar60 + 1;
      uVar59 = 0;
      if (uVar60 == 0) goto LAB_00a82a14;
    }
    auVar146._0_4_ = (uint)*(float *)pauVar51[1] & auVar133._0_4_;
    auVar146._4_4_ = (uint)*(float *)(pauVar51[1] + 4) & auVar133._4_4_;
    auVar146._8_4_ = (uint)*(float *)(pauVar51[1] + 8) & auVar133._8_4_;
    auVar146._12_4_ = (uint)*(float *)(pauVar51[1] + 0xc) & auVar133._12_4_;
    auVar167._0_8_ = CONCAT44(~auVar133._4_4_,~auVar133._0_4_) & 0x7f8000007f800000;
    auVar167._8_4_ = ~auVar133._8_4_ & 0x7f800000;
    auVar167._12_4_ = ~auVar133._12_4_ & 0x7f800000;
    auVar167 = auVar167 | auVar146;
    auVar147._4_4_ = auVar167._0_4_;
    auVar147._0_4_ = auVar167._4_4_;
    auVar147._8_4_ = auVar167._12_4_;
    auVar147._12_4_ = auVar167._8_4_;
    auVar73 = minps(auVar147,auVar167);
    auVar104._0_8_ = auVar73._8_8_;
    auVar104._8_4_ = auVar73._0_4_;
    auVar104._12_4_ = auVar73._4_4_;
    auVar73 = minps(auVar104,auVar73);
    auVar105._0_8_ =
         CONCAT44(-(uint)(auVar73._4_4_ == auVar167._4_4_) & auVar133._4_4_,
                  -(uint)(auVar73._0_4_ == auVar167._0_4_) & auVar133._0_4_);
    auVar105._8_4_ = -(uint)(auVar73._8_4_ == auVar167._8_4_) & auVar133._8_4_;
    auVar105._12_4_ = -(uint)(auVar73._12_4_ == auVar167._12_4_) & auVar133._12_4_;
    iVar44 = movmskps(iVar53,auVar105);
    if (iVar44 != 0) {
      auVar133._8_4_ = auVar105._8_4_;
      auVar133._0_8_ = auVar105._0_8_;
      auVar133._12_4_ = auVar105._12_4_;
    }
    uVar48 = *(undefined8 *)pauVar51[2];
    iVar53 = *(int *)(pauVar51[2] + 8);
    uVar59 = movmskps(iVar44,auVar133);
    lVar8 = 0;
    if (uVar59 != 0) {
      for (; (uVar59 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
      }
    }
    *(undefined4 *)(local_2a8 + lVar8 * 4) = 0;
    *pauVar51 = _local_2a8;
    iVar44 = movmskps((int)pauVar51,_local_2a8);
    uVar47 = CONCAT44((int)((ulong)pauVar51 >> 0x20),iVar44);
    uVar59 = ~uVar60;
    if (iVar44 != 0) {
      uVar59 = -uVar60;
    }
    uVar56 = (ulong)uVar59;
    fVar109 = (float)uVar48;
    fVar137 = (float)((ulong)uVar48 >> 0x20) - fVar109;
    _local_518 = (int *)CONCAT44(fVar137 * 0.33333334 + fVar109,fVar137 * 0.0 + fVar109);
    uStack_510 = (void *)CONCAT44(fVar137 * 1.0 + fVar109,fVar137 * 0.6666667 + fVar109);
    local_198 = *(float *)(local_518 + lVar8 * 4);
    fStack_194 = *(float *)(local_518 + lVar8 * 4 + 4);
  } while( true );
LAB_00a82a14:
  if (bVar55 != false) {
    return bVar55;
  }
  fVar149 = *(float *)(ray + k * 4 + 0x80);
  auVar134._4_4_ = -(uint)(fStack_1f4 <= fVar149);
  auVar134._0_4_ = -(uint)(local_1f8 <= fVar149);
  auVar134._8_4_ = -(uint)(fStack_1f0 <= fVar149);
  auVar134._12_4_ = -(uint)(fStack_1ec <= fVar149);
  uVar59 = movmskps((int)pauVar51,auVar134);
  uVar59 = (uint)local_3a0 & uVar59;
  if (uVar59 == 0) {
    return false;
  }
  goto LAB_00a7fed1;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }